

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void stats_arena_print(emitter_t *emitter,uint i,_Bool bins,_Bool large,_Bool mutex,_Bool extents)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar3;
  uint64_t uVar4;
  emitter_col_t *peVar5;
  int iVar6;
  uint uVar7;
  emitter_col_t *peVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  undefined7 in_register_00000011;
  long lVar10;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar11;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar12;
  emitter_col_t *peVar13;
  char *format;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  emitter_type_t eVar14;
  char *pcVar15;
  byte bVar16;
  emitter_t *peVar17;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar18;
  bool bVar19;
  size_t sz_43;
  emitter_t *local_1158;
  uint64_t uptime_s;
  uint64_t uptime;
  emitter_row_t local_1140;
  emitter_row_t local_1138;
  size_t sz_57;
  undefined4 local_1124;
  emitter_row_t local_1120;
  size_t sz_1;
  emitter_type_t local_1110;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_1108;
  emitter_col_t *local_1100;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_10f8;
  uint64_t uptime_s_16;
  emitter_col_t col_name;
  emitter_row_t local_1048;
  uint32_t nregs;
  size_t curslabs;
  size_t curregs;
  size_t miblen_34;
  emitter_type_t local_1020;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_1018;
  emitter_col_t *local_1010;
  emitter_col_t *local_1008;
  uint64_t nreslabs;
  uint64_t nflushes;
  uint64_t nfills;
  uint64_t nrequests;
  uint64_t ndalloc;
  uint64_t nmalloc;
  size_t nonfull_slabs;
  undefined4 local_fc4;
  undefined4 local_fc0;
  uint nthreads;
  uint32_t nshards;
  uint nbins;
  size_t sz_35;
  emitter_type_t local_fa8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_fa0;
  emitter_col_t *local_f98;
  emitter_col_t *local_f90;
  emitter_col_t col_nonfull_slabs;
  size_t lextent_size;
  emitter_type_t local_f58;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_f50;
  emitter_col_t *local_f48;
  emitter_col_t *local_f40;
  emitter_row_t local_f38;
  uint64_t large_nflushes;
  uint64_t large_nfills;
  uint64_t large_nrequests;
  uint64_t large_ndalloc;
  uint64_t large_nmalloc;
  size_t large_allocated;
  uint64_t small_nflushes;
  uint64_t small_nfills;
  uint64_t small_nrequests;
  uint64_t small_ndalloc;
  uint64_t small_nmalloc;
  size_t small_allocated;
  uint64_t muzzy_purged;
  uint64_t muzzy_nmadvise;
  uint64_t muzzy_npurge;
  uint64_t dirty_purged;
  uint64_t dirty_nmadvise;
  uint64_t dirty_npurge;
  size_t pmuzzy;
  size_t pdirty;
  size_t pactive;
  ssize_t muzzy_decay_ms;
  uint64_t nslabs;
  size_t curlextents;
  emitter_type_t local_e70;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_e68;
  emitter_col_t *local_e60;
  emitter_col_t *local_e58;
  uint64_t nrequests_1;
  emitter_type_t local_e48;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_e40;
  emitter_col_t *local_e38;
  emitter_col_t *local_e30;
  size_t sz;
  emitter_type_t local_e20;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_e18 [2];
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_e08;
  undefined4 local_df8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_df0;
  undefined4 local_dd0;
  ulong local_dc8 [4];
  undefined4 local_da8;
  ulong local_da0;
  undefined4 local_d80;
  ulong local_d78 [4];
  undefined4 local_d58;
  ulong local_d50;
  undefined4 local_d30;
  ulong local_d28 [4];
  undefined4 local_d08;
  ulong local_d00;
  undefined4 local_ce0;
  ulong local_cd8 [4];
  undefined4 local_cb8;
  ulong local_cb0;
  undefined4 local_c90;
  undefined1 local_c88 [24];
  uint64_t ndalloc_1;
  emitter_type_t local_c68;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_c60;
  emitter_col_t *local_c58;
  emitter_col_t *local_c50;
  emitter_col_t header_nonfull_slabs;
  emitter_col_t col_count_nflushes;
  emitter_col_t col_count_nfills;
  emitter_col_t col_count_nrequests;
  size_t tcache_bytes;
  size_t extent_avail;
  size_t metadata_thp;
  size_t resident;
  size_t internal;
  size_t base;
  size_t retained;
  size_t mapped;
  size_t page;
  ssize_t dirty_decay_ms;
  char *dss;
  size_t slab_size;
  size_t reg_size;
  size_t page_1;
  undefined8 local_b38;
  undefined4 local_b30;
  char *local_b28;
  emitter_col_t *local_b20;
  emitter_col_t *local_b18;
  undefined8 local_b10;
  undefined4 local_b08;
  char *local_b00;
  undefined8 *local_af8;
  undefined8 *local_af0;
  emitter_col_t col_count_nflushes_ps;
  emitter_col_t col_count_nfills_ps;
  emitter_col_t col_count_nrequests_ps;
  emitter_col_t col_regs;
  size_t miblen;
  emitter_type_t local_a40;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_a38;
  emitter_col_t *local_a30;
  emitter_col_t *local_a28;
  emitter_col_t local_888;
  emitter_col_t header_regs;
  uint64_t nmalloc_1;
  emitter_type_t local_830;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_828;
  emitter_col_t *local_820;
  emitter_col_t *local_818;
  emitter_row_t row;
  emitter_col_t local_7e8;
  emitter_col_t local_7c0;
  emitter_col_t local_798;
  emitter_col_t header_justify_spacer;
  emitter_col_t local_748;
  emitter_col_t local_720;
  emitter_col_t local_6f8;
  emitter_col_t header_nreslabs_ps;
  emitter_col_t col_nreslabs_ps;
  emitter_col_t header_nreslabs;
  emitter_col_t col_nreslabs;
  emitter_col_t header_nslabs;
  emitter_col_t col_nslabs;
  emitter_col_t header_nflushes_ps;
  emitter_col_t col_nflushes_ps;
  emitter_col_t header_nflushes;
  emitter_col_t col_nflushes;
  emitter_col_t header_nfills_ps;
  emitter_col_t col_nfills_ps;
  emitter_col_t header_nfills;
  emitter_col_t col_nfills;
  emitter_col_t header_util;
  emitter_col_t col_util;
  emitter_col_t col_justify_spacer;
  emitter_col_t header_pgs;
  emitter_col_t col_pgs;
  emitter_col_t local_3d8;
  emitter_col_t local_3b0;
  emitter_col_t local_388;
  emitter_col_t local_360;
  emitter_col_t local_338;
  emitter_col_t local_310;
  emitter_col_t col_mutex32 [1];
  emitter_col_t local_2b8;
  undefined8 local_290;
  emitter_type_t local_288;
  char *local_280;
  emitter_col_t *local_278;
  emitter_col_t *local_270;
  emitter_col_t local_268;
  emitter_col_t local_240;
  emitter_col_t local_218;
  emitter_col_t local_1f0;
  emitter_col_t local_1c8;
  emitter_col_t local_1a0;
  undefined8 local_178;
  int local_170;
  char *local_168;
  undefined8 *local_160;
  emitter_col_t *local_158;
  emitter_col_t local_150;
  emitter_col_t header_mutex32 [1];
  undefined8 local_f8;
  emitter_type_t local_f0;
  char *local_e8;
  emitter_col_t *local_e0;
  undefined8 *local_d8;
  undefined8 local_d0;
  emitter_type_t local_c8;
  char *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  emitter_type_t local_a0;
  char *local_98;
  undefined8 *local_90;
  undefined8 *local_88;
  undefined8 local_80;
  undefined4 local_78;
  char *local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  undefined8 local_58;
  undefined4 local_50;
  char *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  
  local_fc4 = (undefined4)CONCAT71(in_register_00000089,extents);
  uptime_s_16 = CONCAT44(uptime_s_16._4_4_,(int)CONCAT71(in_register_00000081,mutex));
  local_fc0 = (undefined4)CONCAT71(in_register_00000009,large);
  aVar3.uint64_val._4_4_ = 0;
  aVar3.unsigned_val = i;
  sz = 8;
  iVar6 = je_mallctl("arenas.page",&page,&sz,(void *)0x0,0);
  if (iVar6 != 0) {
LAB_0013cac5:
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar15 = "arenas.page";
    goto LAB_0013cab9;
  }
  miblen = 7;
  sz_1 = 4;
  iVar6 = je_mallctlnametomib("stats.arenas.0.nthreads",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.nthreads";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&nthreads,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) {
LAB_0013c8c5:
    malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_kv(emitter,"nthreads","assigned threads",emitter_type_unsigned,&nthreads);
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.uptime",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.uptime";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&uptime,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_kv(emitter,"uptime_ns","uptime",emitter_type_uint64,&uptime);
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.dss",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.dss";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&dss,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_kv(emitter,"dss","dss allocation precedence",emitter_type_string,&dss);
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.dirty_decay_ms",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.dirty_decay_ms";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&dirty_decay_ms,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.muzzy_decay_ms",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.muzzy_decay_ms";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&muzzy_decay_ms,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.pactive",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.pactive";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&pactive,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.pdirty",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.pdirty";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&pdirty,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.pmuzzy",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.pmuzzy";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&pmuzzy,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.dirty_npurge",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.dirty_npurge";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&dirty_npurge,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.dirty_nmadvise",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.dirty_nmadvise";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&dirty_nmadvise,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.dirty_purged",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.dirty_purged";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&dirty_purged,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.muzzy_npurge",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.muzzy_npurge";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&muzzy_npurge,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.muzzy_nmadvise",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.muzzy_nmadvise";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&muzzy_nmadvise,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.muzzy_purged",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.muzzy_purged";
    goto LAB_0013cab9;
  }
  local_1124 = (undefined4)CONCAT71(in_register_00000011,bins);
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&muzzy_purged,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(emitter,"dirty_decay_ms",emitter_type_ssize,&dirty_decay_ms);
  emitter_json_kv(emitter,"muzzy_decay_ms",emitter_type_ssize,&muzzy_decay_ms);
  emitter_json_kv(emitter,"pactive",emitter_type_size,&pactive);
  emitter_json_kv(emitter,"pdirty",emitter_type_size,&pdirty);
  emitter_json_kv(emitter,"pmuzzy",emitter_type_size,&pmuzzy);
  emitter_json_kv(emitter,"dirty_npurge",emitter_type_uint64,&dirty_npurge);
  emitter_json_kv(emitter,"dirty_nmadvise",emitter_type_uint64,&dirty_nmadvise);
  emitter_json_kv(emitter,"dirty_purged",emitter_type_uint64,&dirty_purged);
  emitter_json_kv(emitter,"muzzy_npurge",emitter_type_uint64,&muzzy_npurge);
  emitter_json_kv(emitter,"muzzy_nmadvise",emitter_type_uint64,&muzzy_nmadvise);
  emitter_json_kv(emitter,"muzzy_purged",emitter_type_uint64,&muzzy_purged);
  local_f38.cols.qlh_first = (anon_struct_8_1_803fbc3e_for_cols)&local_58;
  local_58 = 0x900000001;
  local_170 = 8;
  local_48 = "decaying:";
  local_60 = &local_178;
  local_178 = 0x600000001;
  local_168 = "time";
  local_160 = &local_80;
  local_80 = 0xd00000001;
  local_70 = "npages";
  local_b0 = &local_a8;
  local_a8 = 0xd00000001;
  local_98 = "sweeps";
  local_d8 = &local_d0;
  local_d0 = 0xd00000001;
  local_c0 = "madvises";
  local_b8 = &local_f8;
  local_f8 = 0xd00000001;
  local_e8 = "purged";
  local_1158 = emitter;
  local_158 = (emitter_col_t *)local_f38.cols.qlh_first;
  local_f0 = local_170;
  local_e0 = (emitter_col_t *)local_f38.cols.qlh_first;
  local_c8 = local_170;
  local_a0 = local_170;
  local_90 = local_d8;
  local_88 = local_160;
  local_78 = local_170;
  local_68 = local_b0;
  local_50 = local_170;
  local_40 = local_60;
  local_38 = local_b8;
  emitter_table_row(emitter,&local_f38);
  local_48 = "dirty:";
  local_170 = (int)(dirty_decay_ms >> 0x3f) * -2 + 6;
  pcVar15 = "N/A";
  if (dirty_decay_ms < 0) {
    dirty_decay_ms = (ssize_t)"N/A";
  }
  local_78 = 5;
  local_70 = (char *)pdirty;
  local_a0 = 4;
  local_98 = (char *)dirty_npurge;
  local_c8 = 4;
  local_c0 = (char *)dirty_nmadvise;
  local_f0 = 4;
  local_e8 = (char *)dirty_purged;
  local_168 = (char *)dirty_decay_ms;
  emitter_table_row(local_1158,&local_f38);
  local_48 = "muzzy:";
  local_170 = (int)(muzzy_decay_ms >> 0x3f) * -2 + 6;
  if (-1 < muzzy_decay_ms) {
    pcVar15 = (char *)muzzy_decay_ms;
  }
  local_78 = 5;
  local_70 = (char *)pmuzzy;
  eVar14 = emitter_type_uint64;
  local_98 = (char *)muzzy_npurge;
  local_c0 = (char *)muzzy_nmadvise;
  local_e8 = (char *)muzzy_purged;
  local_168 = pcVar15;
  local_f0 = eVar14;
  local_c8 = eVar14;
  local_a0 = eVar14;
  emitter_table_row(local_1158,&local_f38);
  peVar17 = local_1158;
  local_2b8.justify = emitter_justify_left;
  local_2b8.width = 0x15;
  local_2b8.type = emitter_type_title;
  local_2b8.field_3.str_val = "";
  local_798.link.qre_prev = &local_2b8;
  local_2b8.link.qre_next = &local_798;
  local_798.justify = emitter_justify_right;
  local_798.width = 0x10;
  local_798.type = emitter_type_title;
  local_798.field_3.str_val = "allocated";
  local_7c0.link.qre_prev = &local_798;
  local_798.link.qre_next = &local_7c0;
  local_7c0.justify = emitter_justify_right;
  local_7c0.width = 0x10;
  local_7c0.type = emitter_type_title;
  local_7c0.field_3.str_val = "nmalloc";
  local_6f8.link.qre_prev = &local_7c0;
  local_7c0.link.qre_next = &local_6f8;
  local_6f8.justify = emitter_justify_right;
  local_6f8.width = 8;
  local_6f8.type = emitter_type_title;
  local_6f8.field_3.str_val = "(#/sec)";
  local_7e8.link.qre_prev = &local_6f8;
  local_6f8.link.qre_next = &local_7e8;
  local_7e8.justify = emitter_justify_right;
  local_7e8.width = 0x10;
  local_7e8.type = emitter_type_title;
  local_7e8.field_3.str_val = "ndalloc";
  local_720.link.qre_prev = &local_7e8;
  local_720.link.qre_next = &local_2b8;
  local_7e8.link.qre_next = &local_720;
  local_2b8.link.qre_prev = &local_720;
  local_720.justify = emitter_justify_right;
  local_720.width = 8;
  local_720.type = emitter_type_title;
  local_720.field_3.str_val = "(#/sec)";
  col_count_nrequests.link.qre_next = &col_count_nrequests;
  col_count_nrequests.link.qre_prev = &col_count_nrequests;
  if (&local_2b8 != (emitter_col_t *)0x0) {
    local_2b8.link.qre_prev = &col_count_nrequests;
    col_count_nrequests.link.qre_prev = &local_720;
    col_count_nrequests.link.qre_next = &local_2b8;
  }
  col_count_nrequests.justify = emitter_justify_right;
  col_count_nrequests.width = 0x10;
  col_count_nrequests.type = emitter_type_title;
  col_count_nrequests.field_3.str_val = "nrequests";
  col_count_nrequests_ps.link.qre_next = &col_count_nrequests_ps;
  col_count_nrequests_ps.link.qre_prev = &col_count_nrequests_ps;
  if (col_count_nrequests.link.qre_next != (emitter_col_t *)0x0) {
    col_count_nrequests_ps.link.qre_prev = ((col_count_nrequests.link.qre_next)->link).qre_prev;
    col_count_nrequests_ps.link.qre_next = col_count_nrequests.link.qre_next;
    ((col_count_nrequests_ps.link.qre_prev)->link).qre_next = &col_count_nrequests_ps;
    ((col_count_nrequests.link.qre_next)->link).qre_prev = &col_count_nrequests_ps;
  }
  peVar8 = col_count_nrequests_ps.link.qre_next;
  col_count_nrequests_ps.justify = emitter_justify_right;
  col_count_nrequests_ps.width = 10;
  col_count_nrequests_ps.type = emitter_type_title;
  col_count_nrequests_ps.field_3.str_val = "(#/sec)";
  col_count_nfills.link.qre_next = &col_count_nfills;
  col_count_nfills.link.qre_prev = &col_count_nfills;
  if (col_count_nrequests_ps.link.qre_next != (emitter_col_t *)0x0) {
    col_count_nfills.link.qre_prev = ((col_count_nrequests_ps.link.qre_next)->link).qre_prev;
    col_count_nfills.link.qre_next = col_count_nrequests_ps.link.qre_next;
    ((col_count_nfills.link.qre_prev)->link).qre_next = &col_count_nfills;
    ((col_count_nrequests_ps.link.qre_next)->link).qre_prev = &col_count_nfills;
    col_count_nfills.link.qre_next = peVar8;
  }
  col_count_nfills.justify = emitter_justify_right;
  col_count_nfills.width = 0x10;
  col_count_nfills.type = emitter_type_title;
  col_count_nfills.field_3.str_val = "nfill";
  col_count_nfills_ps.link.qre_next = &col_count_nfills_ps;
  col_count_nfills_ps.link.qre_prev = &col_count_nfills_ps;
  if (col_count_nfills.link.qre_next != (emitter_col_t *)0x0) {
    col_count_nfills_ps.link.qre_prev = ((col_count_nfills.link.qre_next)->link).qre_prev;
    col_count_nfills_ps.link.qre_next = col_count_nfills.link.qre_next;
    ((col_count_nfills_ps.link.qre_prev)->link).qre_next = &col_count_nfills_ps;
    ((col_count_nfills.link.qre_next)->link).qre_prev = &col_count_nfills_ps;
  }
  peVar8 = col_count_nfills_ps.link.qre_next;
  col_count_nfills_ps.justify = emitter_justify_right;
  col_count_nfills_ps.width = 10;
  col_count_nfills_ps.type = emitter_type_title;
  col_count_nfills_ps.field_3.str_val = "(#/sec)";
  col_count_nflushes.link.qre_next = &col_count_nflushes;
  col_count_nflushes.link.qre_prev = &col_count_nflushes;
  if (col_count_nfills_ps.link.qre_next != (emitter_col_t *)0x0) {
    col_count_nflushes.link.qre_prev = ((col_count_nfills_ps.link.qre_next)->link).qre_prev;
    col_count_nflushes.link.qre_next = col_count_nfills_ps.link.qre_next;
    ((col_count_nflushes.link.qre_prev)->link).qre_next = &col_count_nflushes;
    ((col_count_nfills_ps.link.qre_next)->link).qre_prev = &col_count_nflushes;
    col_count_nflushes.link.qre_next = peVar8;
  }
  col_count_nflushes.justify = emitter_justify_right;
  col_count_nflushes.width = 0x10;
  col_count_nflushes.type = emitter_type_title;
  col_count_nflushes.field_3.str_val = "nflush";
  col_count_nflushes_ps.link.qre_next = &col_count_nflushes_ps;
  col_count_nflushes_ps.link.qre_prev = &col_count_nflushes_ps;
  if (col_count_nflushes.link.qre_next != (emitter_col_t *)0x0) {
    col_count_nflushes_ps.link.qre_prev = ((col_count_nflushes.link.qre_next)->link).qre_prev;
    ((col_count_nflushes_ps.link.qre_prev)->link).qre_next = &col_count_nflushes_ps;
    col_count_nflushes_ps.link.qre_next = col_count_nflushes.link.qre_next;
    ((col_count_nflushes.link.qre_next)->link).qre_prev = &col_count_nflushes_ps;
  }
  col_count_nflushes_ps.justify = emitter_justify_right;
  col_count_nflushes_ps.width = 10;
  col_count_nflushes_ps.type = emitter_type_title;
  col_count_nflushes_ps.field_3.str_val = "(#/sec)";
  local_1048.cols.qlh_first =
       (anon_struct_8_1_803fbc3e_for_cols)
       (anon_struct_8_1_803fbc3e_for_cols)col_count_nflushes_ps.link.qre_next;
  emitter_table_row(local_1158,&local_1048);
  col_count_nflushes_ps.type = eVar14;
  col_count_nfills_ps.type = eVar14;
  col_count_nrequests_ps.type = eVar14;
  local_720.type = eVar14;
  local_6f8.type = eVar14;
  emitter_json_object_kv_begin(peVar17,"small");
  local_2b8.field_3.str_val = "small:";
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.small.allocated",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.small.allocated";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&small_allocated,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(local_1158,"allocated",emitter_type_size,&small_allocated);
  local_798.type = emitter_type_size;
  local_798.field_3.size_val = small_allocated;
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.small.nmalloc",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.small.nmalloc";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&small_nmalloc,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(local_1158,"nmalloc",emitter_type_uint64,&small_nmalloc);
  local_7c0.type = emitter_type_uint64;
  local_7c0.field_3.uint64_val = small_nmalloc;
  if (small_nmalloc == 0 || uptime == 0) {
    local_6f8.field_3.uint64_val = 0;
  }
  else {
    local_6f8.field_3.uint64_val = small_nmalloc;
    if (999999999 < uptime) {
      local_6f8.field_3.uint64_val = small_nmalloc / (uptime / 1000000000);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.small.ndalloc",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.small.ndalloc";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&small_ndalloc,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(local_1158,"ndalloc",emitter_type_uint64,&small_ndalloc);
  local_7e8.type = emitter_type_uint64;
  local_7e8.field_3.uint64_val = small_ndalloc;
  if (small_ndalloc == 0 || uptime == 0) {
    local_720.field_3.uint64_val = 0;
  }
  else {
    local_720.field_3.uint64_val = small_ndalloc;
    if (999999999 < uptime) {
      local_720.field_3.uint64_val = small_ndalloc / (uptime / 1000000000);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.small.nrequests",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.small.nrequests";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&small_nrequests,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(local_1158,"nrequests",emitter_type_uint64,&small_nrequests);
  col_count_nrequests.type = emitter_type_uint64;
  col_count_nrequests.field_3.uint64_val = small_nrequests;
  if (small_nrequests == 0 || uptime == 0) {
    col_count_nrequests_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nrequests_ps.field_3.uint64_val = small_nrequests;
    if (999999999 < uptime) {
      col_count_nrequests_ps.field_3.uint64_val = small_nrequests / (uptime / 1000000000);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.small.nfills",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.small.nfills";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&small_nfills,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(local_1158,"nfills",emitter_type_uint64,&small_nfills);
  col_count_nfills.type = emitter_type_uint64;
  col_count_nfills.field_3.uint64_val = small_nfills;
  if (small_nfills == 0 || uptime == 0) {
    col_count_nfills_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nfills_ps.field_3.uint64_val = small_nfills;
    if (999999999 < uptime) {
      col_count_nfills_ps.field_3.uint64_val = small_nfills / (uptime / 1000000000);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.small.nflushes",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.small.nflushes";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&small_nflushes,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(local_1158,"nflushes",emitter_type_uint64,&small_nflushes);
  peVar17 = local_1158;
  col_count_nflushes.type = emitter_type_uint64;
  col_count_nflushes.field_3.uint64_val = small_nflushes;
  if (small_nflushes == 0 || uptime == 0) {
    col_count_nflushes_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nflushes_ps.field_3.uint64_val = small_nflushes;
    if (999999999 < uptime) {
      col_count_nflushes_ps.field_3.uint64_val = small_nflushes / (uptime / 1000000000);
    }
  }
  emitter_table_row(local_1158,&local_1048);
  emitter_json_object_end(peVar17);
  emitter_json_object_kv_begin(peVar17,"large");
  local_2b8.field_3.str_val = "large:";
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.large.allocated",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.large.allocated";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&large_allocated,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(local_1158,"allocated",emitter_type_size,&large_allocated);
  local_798.type = emitter_type_size;
  local_798.field_3.size_val = large_allocated;
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.large.nmalloc",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.large.nmalloc";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&large_nmalloc,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(local_1158,"nmalloc",emitter_type_uint64,&large_nmalloc);
  local_7c0.type = emitter_type_uint64;
  local_7c0.field_3.uint64_val = large_nmalloc;
  if (large_nmalloc == 0 || uptime == 0) {
    local_6f8.field_3.uint64_val = 0;
  }
  else {
    local_6f8.field_3.uint64_val = large_nmalloc;
    if (999999999 < uptime) {
      local_6f8.field_3.uint64_val = large_nmalloc / (uptime / 1000000000);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.large.ndalloc",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.large.ndalloc";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&large_ndalloc,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(local_1158,"ndalloc",emitter_type_uint64,&large_ndalloc);
  local_7e8.type = emitter_type_uint64;
  local_7e8.field_3.uint64_val = large_ndalloc;
  if (large_ndalloc == 0 || uptime == 0) {
    local_720.field_3.uint64_val = 0;
  }
  else {
    local_720.field_3.uint64_val = large_ndalloc;
    if (999999999 < uptime) {
      local_720.field_3.uint64_val = large_ndalloc / (uptime / 1000000000);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.large.nrequests",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.large.nrequests";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&large_nrequests,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(local_1158,"nrequests",emitter_type_uint64,&large_nrequests);
  col_count_nrequests.type = emitter_type_uint64;
  col_count_nrequests.field_3.uint64_val = large_nrequests;
  if (large_nrequests == 0 || uptime == 0) {
    col_count_nrequests_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nrequests_ps.field_3.uint64_val = large_nrequests;
    if (999999999 < uptime) {
      col_count_nrequests_ps.field_3.uint64_val = large_nrequests / (uptime / 1000000000);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.large.nfills",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.large.nfills";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&large_nfills,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(local_1158,"nfills",emitter_type_uint64,&large_nfills);
  col_count_nfills.type = emitter_type_uint64;
  col_count_nfills.field_3.uint64_val = large_nfills;
  if (large_nfills == 0 || uptime == 0) {
    col_count_nfills_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nfills_ps.field_3.uint64_val = large_nfills;
    if (999999999 < uptime) {
      col_count_nfills_ps.field_3.uint64_val = large_nfills / (uptime / 1000000000);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.large.nflushes",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.large.nflushes";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&large_nflushes,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(local_1158,"nflushes",emitter_type_uint64,&large_nflushes);
  peVar17 = local_1158;
  col_count_nflushes.type = emitter_type_uint64;
  col_count_nflushes.field_3.uint64_val = large_nflushes;
  if (large_nflushes == 0 || uptime == 0) {
    col_count_nflushes_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nflushes_ps.field_3.uint64_val = large_nflushes;
    if (999999999 < uptime) {
      col_count_nflushes_ps.field_3.uint64_val = large_nflushes / (uptime / 1000000000);
    }
  }
  emitter_table_row(local_1158,&local_1048);
  emitter_json_object_end(peVar17);
  peVar17 = local_1158;
  local_798.field_3.str_val = (char *)(large_allocated + small_allocated);
  local_7e8.field_3.str_val = (char *)(large_ndalloc + small_ndalloc);
  local_2b8.field_3.str_val = "total:";
  col_count_nrequests.field_3.str_val = (char *)(large_nrequests + small_nrequests);
  col_count_nfills.field_3.str_val = (char *)(large_nfills + small_nfills);
  col_count_nflushes.field_3.str_val = (char *)(large_nflushes + small_nflushes);
  local_7c0.field_3.str_val = (char *)(large_nmalloc + small_nmalloc);
  if (uptime == 0 || (char *)local_7c0.field_3.uint64_val == (char *)0x0) {
    local_6f8.field_3.uint64_val = 0;
  }
  else {
    local_6f8.field_3.str_val = local_7c0.field_3.str_val;
    if (999999999 < uptime) {
      local_6f8.field_3.uint64_val = local_7c0.field_3.uint64_val / (uptime / 1000000000);
    }
  }
  if ((char *)local_7e8.field_3.uint64_val == (char *)0x0 || uptime == 0) {
    local_720.field_3.uint64_val = 0;
  }
  else {
    local_720.field_3.str_val = local_7e8.field_3.str_val;
    if (999999999 < uptime) {
      local_720.field_3.uint64_val = local_7e8.field_3.uint64_val / (uptime / 1000000000);
    }
  }
  if (col_count_nrequests.field_3.uint64_val == 0 || uptime == 0) {
    col_count_nrequests_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nrequests_ps.field_3.str_val = col_count_nrequests.field_3.str_val;
    if (999999999 < uptime) {
      col_count_nrequests_ps.field_3.uint64_val =
           col_count_nrequests.field_3.uint64_val / (uptime / 1000000000);
    }
  }
  if (col_count_nfills.field_3.uint64_val == 0 || uptime == 0) {
    col_count_nfills_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nfills_ps.field_3.str_val = col_count_nfills.field_3.str_val;
    if (999999999 < uptime) {
      col_count_nfills_ps.field_3.uint64_val =
           col_count_nfills.field_3.uint64_val / (uptime / 1000000000);
    }
  }
  if (col_count_nflushes.field_3.uint64_val == 0 || uptime == 0) {
    col_count_nflushes_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nflushes_ps.field_3.str_val = col_count_nflushes.field_3.str_val;
    if (999999999 < uptime) {
      col_count_nflushes_ps.field_3.uint64_val =
           col_count_nflushes.field_3.uint64_val / (uptime / 1000000000);
    }
  }
  emitter_table_row(local_1158,&local_1048);
  local_1120.cols.qlh_first = (anon_struct_8_1_803fbc3e_for_cols)&local_b10;
  local_b10 = 0x1500000000;
  local_b30 = 8;
  local_b00 = "";
  local_af8 = &local_b38;
  local_b38 = 0x1000000001;
  local_b28 = "";
  local_b20 = (emitter_col_t *)local_1120.cols.qlh_first;
  local_b18 = (emitter_col_t *)local_1120.cols.qlh_first;
  local_b08 = local_b30;
  local_af0 = local_af8;
  emitter_table_row(peVar17,&local_1120);
  local_b30 = 5;
  local_b00 = "active:";
  local_b28 = (char *)(page * pactive);
  emitter_table_row(peVar17,&local_1120);
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.mapped",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.mapped";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&mapped,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(peVar17,"mapped",emitter_type_size,&mapped);
  local_b00 = "mapped:";
  local_b28 = (char *)mapped;
  emitter_table_row(peVar17,&local_1120);
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.retained",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.retained";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&retained,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(peVar17,"retained",emitter_type_size,&retained);
  local_b00 = "retained:";
  local_b28 = (char *)retained;
  emitter_table_row(peVar17,&local_1120);
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.base",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.base";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&base,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(peVar17,"base",emitter_type_size,&base);
  local_b00 = "base:";
  local_b28 = (char *)base;
  emitter_table_row(peVar17,&local_1120);
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.internal",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.internal";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&internal,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(peVar17,"internal",emitter_type_size,&internal);
  local_b00 = "internal:";
  local_b28 = (char *)internal;
  emitter_table_row(peVar17,&local_1120);
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.metadata_thp",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.metadata_thp";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&metadata_thp,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(peVar17,"metadata_thp",emitter_type_size,&metadata_thp);
  local_b00 = "metadata_thp:";
  local_b28 = (char *)metadata_thp;
  emitter_table_row(peVar17,&local_1120);
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.tcache_bytes",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.tcache_bytes";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&tcache_bytes,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(peVar17,"tcache_bytes",emitter_type_size,&tcache_bytes);
  local_b00 = "tcache_bytes:";
  local_b28 = (char *)tcache_bytes;
  emitter_table_row(peVar17,&local_1120);
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.resident",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.resident";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&resident,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(peVar17,"resident",emitter_type_size,&resident);
  local_b00 = "resident:";
  local_b28 = (char *)resident;
  emitter_table_row(peVar17,&local_1120);
  miblen = 7;
  sz_1 = 8;
  iVar6 = je_mallctlnametomib("stats.arenas.0.extent_avail",&sz,&miblen);
  if (iVar6 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar15 = "stats.arenas.0.extent_avail";
    goto LAB_0013cab9;
  }
  local_e18[0] = aVar3;
  iVar6 = je_mallctlbymib(&sz,miblen,&extent_avail,&sz_1,(void *)0x0,0);
  if (iVar6 != 0) goto LAB_0013c8c5;
  emitter_json_kv(peVar17,"extent_avail",emitter_type_size,&extent_avail);
  local_b00 = "extent_avail:";
  local_b28 = (char *)extent_avail;
  emitter_table_row(peVar17,&local_1120);
  uVar4 = uptime;
  if ((char)uptime_s_16 != '\0') {
    row.cols.qlh_first = (anon_struct_8_1_803fbc3e_for_cols)(emitter_col_t *)0x0;
    peVar8 = &local_888;
    mutex_stats_init_cols(&row,"",&col_name,(emitter_col_t *)&sz,peVar8);
    emitter_json_object_kv_begin(peVar17,"mutexes");
    emitter_table_row(peVar17,&row);
    uptime_s = uVar4 / 1000000000;
    for (lVar10 = 0; peVar17 = local_1158, lVar10 != 9; lVar10 = lVar10 + 1) {
      aVar11 = *(anon_union_8_10_2a69db89_for_emitter_col_s_3 *)(arena_mutex_names + lVar10);
      emitter_json_object_kv_begin(local_1158,aVar11.str_val);
      local_e20 = emitter_type_uint64;
      col_name.field_3 = aVar11;
      gen_mutex_ctl_str((char *)&miblen,0x1420eb,arena_mutex_names[lVar10],"num_ops",(char *)peVar8)
      ;
      miblen_34 = 7;
      sz_35 = 8;
      iVar6 = je_mallctlnametomib((char *)&miblen,&sz_1,&miblen_34);
      if (iVar6 != 0) {
LAB_0013c8d6:
        format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
        pcVar15 = (char *)&miblen;
        goto LAB_0013cab9;
      }
      pcVar15 = (char *)0x0;
      local_1108 = aVar3;
      iVar6 = je_mallctlbymib(&sz_1,miblen_34,local_e18,&sz_35,(void *)0x0,0);
      if (iVar6 != 0) goto LAB_0013c8c5;
      local_df8 = 4;
      local_df0 = local_e18[0];
      if (uVar4 == 0) {
        local_df0.uint64_val = 0;
      }
      if ((char *)local_e18[0].uint64_val != (char *)0x0 && 999999999 < uVar4) {
        local_df0.uint64_val = local_e18[0].uint64_val / uptime_s;
      }
      local_dd0 = 4;
      gen_mutex_ctl_str((char *)&miblen,0x1420eb,arena_mutex_names[lVar10],"num_wait",pcVar15);
      miblen_34 = 7;
      sz_35 = 8;
      iVar6 = je_mallctlnametomib((char *)&miblen,&sz_1,&miblen_34);
      if (iVar6 != 0) goto LAB_0013c8d6;
      pcVar15 = (char *)0x0;
      local_1108 = aVar3;
      iVar6 = je_mallctlbymib(&sz_1,miblen_34,local_dc8,&sz_35,(void *)0x0,0);
      if (iVar6 != 0) goto LAB_0013c8c5;
      local_da8 = 4;
      local_da0 = local_dc8[0];
      if (uVar4 == 0) {
        local_da0 = 0;
      }
      if (local_dc8[0] != 0 && 999999999 < uVar4) {
        local_da0 = local_dc8[0] / uptime_s;
      }
      local_d80 = 4;
      gen_mutex_ctl_str((char *)&miblen,0x1420eb,arena_mutex_names[lVar10],"num_spin_acq",pcVar15);
      miblen_34 = 7;
      sz_35 = 8;
      iVar6 = je_mallctlnametomib((char *)&miblen,&sz_1,&miblen_34);
      if (iVar6 != 0) goto LAB_0013c8d6;
      pcVar15 = (char *)0x0;
      local_1108 = aVar3;
      iVar6 = je_mallctlbymib(&sz_1,miblen_34,local_d78,&sz_35,(void *)0x0,0);
      if (iVar6 != 0) goto LAB_0013c8c5;
      local_d58 = 4;
      local_d50 = local_d78[0];
      if (uVar4 == 0) {
        local_d50 = 0;
      }
      if (local_d78[0] != 0 && 999999999 < uVar4) {
        local_d50 = local_d78[0] / uptime_s;
      }
      local_d30 = 4;
      gen_mutex_ctl_str((char *)&miblen,0x1420eb,arena_mutex_names[lVar10],"num_owner_switch",
                        pcVar15);
      miblen_34 = 7;
      sz_35 = 8;
      iVar6 = je_mallctlnametomib((char *)&miblen,&sz_1,&miblen_34);
      if (iVar6 != 0) goto LAB_0013c8d6;
      pcVar15 = (char *)0x0;
      local_1108 = aVar3;
      iVar6 = je_mallctlbymib(&sz_1,miblen_34,local_d28,&sz_35,(void *)0x0,0);
      if (iVar6 != 0) goto LAB_0013c8c5;
      local_d08 = 4;
      local_d00 = local_d28[0];
      if (uVar4 == 0) {
        local_d00 = 0;
      }
      if (local_d28[0] != 0 && 999999999 < uVar4) {
        local_d00 = local_d28[0] / uptime_s;
      }
      local_ce0 = 4;
      gen_mutex_ctl_str((char *)&miblen,0x1420eb,arena_mutex_names[lVar10],"total_wait_time",pcVar15
                       );
      miblen_34 = 7;
      sz_35 = 8;
      iVar6 = je_mallctlnametomib((char *)&miblen,&sz_1,&miblen_34);
      if (iVar6 != 0) goto LAB_0013c8d6;
      pcVar15 = (char *)0x0;
      local_1108 = aVar3;
      iVar6 = je_mallctlbymib(&sz_1,miblen_34,local_cd8,&sz_35,(void *)0x0,0);
      if (iVar6 != 0) goto LAB_0013c8c5;
      local_cb8 = 4;
      local_cb0 = local_cd8[0];
      if (uVar4 == 0) {
        local_cb0 = 0;
      }
      if (local_cd8[0] != 0 && 999999999 < uVar4) {
        local_cb0 = local_cd8[0] / uptime_s;
      }
      local_c90 = 4;
      gen_mutex_ctl_str((char *)&miblen,0x1420eb,arena_mutex_names[lVar10],"max_wait_time",pcVar15);
      miblen_34 = 7;
      sz_35 = 8;
      iVar6 = je_mallctlnametomib((char *)&miblen,&sz_1,&miblen_34);
      if (iVar6 != 0) goto LAB_0013c8d6;
      pcVar15 = (char *)0x0;
      local_1108 = aVar3;
      iVar6 = je_mallctlbymib(&sz_1,miblen_34,local_c88,&sz_35,(void *)0x0,0);
      if (iVar6 != 0) goto LAB_0013c8c5;
      local_888.type = emitter_type_uint32;
      gen_mutex_ctl_str((char *)&miblen,0x1420eb,arena_mutex_names[lVar10],"max_num_thds",pcVar15);
      miblen_34 = 7;
      sz_35 = 4;
      iVar6 = je_mallctlnametomib((char *)&miblen,&sz_1,&miblen_34);
      if (iVar6 != 0) goto LAB_0013c8d6;
      peVar8 = (emitter_col_t *)0x0;
      local_1108 = aVar3;
      iVar6 = je_mallctlbymib(&sz_1,miblen_34,&local_888.field_3,&sz_35,(void *)0x0,0);
      peVar17 = local_1158;
      if (iVar6 != 0) goto LAB_0013c8c5;
      mutex_stats_emit(local_1158,&row,(emitter_col_t *)&sz,&local_888);
      emitter_json_object_end(peVar17);
    }
    emitter_json_object_end(local_1158);
  }
  uVar4 = uptime;
  if ((byte)local_1124 == '\0') {
LAB_0013b9c9:
    if ((char)local_fc0 == '\0') {
LAB_0013c13e:
      local_888.link.qre_prev = (emitter_col_t *)&sz_1;
      if ((char)local_fc4 != '\0') {
        miblen = 0x1400000001;
        local_1020 = emitter_type_size;
        local_1110 = emitter_type_title;
        local_1108.str_val = "size";
        local_1008 = &col_name;
        col_name.link.qre_prev = (emitter_col_t *)&miblen;
        col_name.justify = emitter_justify_right;
        col_name.width = 4;
        col_name.type = emitter_type_unsigned;
        local_1100 = &local_888;
        local_888.justify = emitter_justify_right;
        local_888.width = 4;
        local_888.field_3.str_val = "ind";
        col_name.link.qre_next = (emitter_col_t *)&miblen_34;
        miblen_34 = 0xd00000001;
        local_888.link.qre_next = (emitter_col_t *)&sz_35;
        sz_35 = 0xd00000001;
        local_fa0.str_val = "ndirty";
        local_1010 = (emitter_col_t *)&row;
        row.cols.qlh_first = (anon_struct_8_1_803fbc3e_for_cols)(emitter_col_t *)0xd00000001;
        local_f98 = &local_1a0;
        local_1a0.justify = emitter_justify_right;
        local_1a0.width = 0xd;
        local_1a0.field_3.str_val = "dirty";
        local_338.link.qre_prev = &local_310;
        local_310.justify = emitter_justify_right;
        local_310.width = 0xd;
        local_1f0.link.qre_prev = &local_1c8;
        local_1c8.justify = emitter_justify_right;
        local_1c8.width = 0xd;
        local_1c8.field_3.str_val = "nmuzzy";
        local_360.link.qre_prev = &local_338;
        local_338.justify = emitter_justify_right;
        local_338.width = 0xd;
        local_218.link.qre_prev = &local_1f0;
        local_1f0.justify = emitter_justify_right;
        local_1f0.width = 0xd;
        local_1f0.field_3.str_val = "muzzy";
        local_388.link.qre_prev = &local_360;
        local_360.justify = emitter_justify_right;
        local_360.width = 0xd;
        local_240.link.qre_prev = &local_218;
        local_218.justify = emitter_justify_right;
        local_218.width = 0xd;
        local_218.field_3.str_val = "nretained";
        local_3b0.link.qre_prev = &local_388;
        local_388.justify = emitter_justify_right;
        local_388.width = 0xd;
        local_268.link.qre_prev = &local_240;
        local_240.justify = emitter_justify_right;
        local_240.width = 0xd;
        local_240.field_3.str_val = "retained";
        local_3d8.link.qre_prev = &local_3b0;
        local_3b0.justify = emitter_justify_right;
        local_3b0.width = 0xd;
        local_270 = &local_268;
        local_268.justify = emitter_justify_right;
        local_268.width = 0xd;
        local_268.field_3.str_val = "ntotal";
        local_a28 = &local_3d8;
        local_3d8.justify = emitter_justify_right;
        local_3d8.width = 0xd;
        local_10f8.str_val = (char *)&local_290;
        local_290 = 0xd00000001;
        local_280 = "total";
        sz_1 = 0xc00000001;
        local_fa8 = local_1110;
        local_f90 = local_1100;
        local_a40 = local_1020;
        local_a30 = local_1008;
        local_888.type = local_1110;
        local_748._0_8_ = col_name.link.qre_prev;
        local_3d8.type = local_1020;
        local_3d8.link.qre_next = col_name.link.qre_prev;
        local_3b0.type = local_1020;
        local_3b0.link.qre_next = local_a28;
        local_388.type = local_1020;
        local_388.link.qre_next = local_3d8.link.qre_prev;
        local_360.type = local_1020;
        local_360.link.qre_next = local_3b0.link.qre_prev;
        local_338.type = local_1020;
        local_338.link.qre_next = local_388.link.qre_prev;
        local_310.type = local_1020;
        local_310.link.qre_next = local_360.link.qre_prev;
        local_310.link.qre_prev = local_1010;
        local_288 = local_1110;
        local_278 = local_888.link.qre_prev;
        local_268.type = local_1110;
        local_268.link.qre_next = (emitter_col_t *)local_10f8.str_val;
        local_240.type = local_1110;
        local_240.link.qre_next = local_270;
        local_218.type = local_1110;
        local_218.link.qre_next = local_268.link.qre_prev;
        local_1f0.type = local_1110;
        local_1f0.link.qre_next = local_240.link.qre_prev;
        local_1c8.type = local_1110;
        local_1c8.link.qre_next = local_218.link.qre_prev;
        local_1c8.link.qre_prev = local_f98;
        local_1a0.type = local_1110;
        local_1a0.link.qre_next = local_1f0.link.qre_prev;
        local_1a0.link.qre_prev = local_888.link.qre_next;
        local_150._0_8_ = local_888.link.qre_prev;
        emitter_table_printf(peVar17,"extents:");
        emitter_table_row(peVar17,(emitter_row_t *)&local_150);
        emitter_json_array_kv_begin(peVar17,"extents");
        aVar11.uint64_val = 0;
        bVar19 = false;
        while( true ) {
          peVar17 = local_1158;
          if ((char *)aVar11.uint64_val == (char *)0xc7) break;
          ndalloc_1 = 7;
          nrequests_1 = 8;
          iVar6 = je_mallctlnametomib("stats.arenas.0.extents.0.ndirty",&sz,&ndalloc_1);
          if (iVar6 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar15 = "stats.arenas.0.extents.0.ndirty";
            goto LAB_0013cab9;
          }
          local_e18[0] = aVar3;
          local_e08 = aVar11;
          iVar6 = je_mallctlbymib(&sz,ndalloc_1,&nmalloc_1,&nrequests_1,(void *)0x0,0);
          if (iVar6 != 0) goto LAB_0013c8c5;
          nrequests_1 = 7;
          lextent_size = 8;
          iVar6 = je_mallctlnametomib("stats.arenas.0.extents.0.nmuzzy",&sz,&nrequests_1);
          if (iVar6 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar15 = "stats.arenas.0.extents.0.nmuzzy";
            goto LAB_0013cab9;
          }
          local_e18[0] = aVar3;
          local_e08 = aVar11;
          iVar6 = je_mallctlbymib(&sz,nrequests_1,&ndalloc_1,&lextent_size,(void *)0x0,0);
          if (iVar6 != 0) goto LAB_0013c8c5;
          lextent_size = 7;
          curlextents = 8;
          iVar6 = je_mallctlnametomib("stats.arenas.0.extents.0.nretained",&sz,&lextent_size);
          if (iVar6 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar15 = "stats.arenas.0.extents.0.nretained";
            goto LAB_0013cab9;
          }
          local_e18[0] = aVar3;
          local_e08 = aVar11;
          iVar6 = je_mallctlbymib(&sz,lextent_size,&nrequests_1,&curlextents,(void *)0x0,0);
          if (iVar6 != 0) goto LAB_0013c8c5;
          curlextents = 7;
          col_nonfull_slabs.justify = 8;
          col_nonfull_slabs.width = 0;
          iVar6 = je_mallctlnametomib("stats.arenas.0.extents.0.dirty_bytes",&sz,&curlextents);
          if (iVar6 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar15 = "stats.arenas.0.extents.0.dirty_bytes";
            goto LAB_0013cab9;
          }
          local_e18[0] = aVar3;
          local_e08 = aVar11;
          iVar6 = je_mallctlbymib(&sz,curlextents,&lextent_size,(size_t *)&col_nonfull_slabs,
                                  (void *)0x0,0);
          if (iVar6 != 0) goto LAB_0013c8c5;
          col_nonfull_slabs.justify = 7;
          col_nonfull_slabs.width = 0;
          header_nonfull_slabs.justify = 8;
          header_nonfull_slabs.width = 0;
          iVar6 = je_mallctlnametomib("stats.arenas.0.extents.0.muzzy_bytes",&sz,
                                      (size_t *)&col_nonfull_slabs);
          if (iVar6 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar15 = "stats.arenas.0.extents.0.muzzy_bytes";
            goto LAB_0013cab9;
          }
          local_e18[0] = aVar3;
          local_e08 = aVar11;
          iVar6 = je_mallctlbymib(&sz,col_nonfull_slabs._0_8_,&curlextents,
                                  (size_t *)&header_nonfull_slabs,(void *)0x0,0);
          if (iVar6 != 0) goto LAB_0013c8c5;
          header_nonfull_slabs.justify = 7;
          header_nonfull_slabs.width = 0;
          col_regs.justify = 8;
          col_regs.width = 0;
          iVar6 = je_mallctlnametomib("stats.arenas.0.extents.0.retained_bytes",&sz,
                                      (size_t *)&header_nonfull_slabs);
          if (iVar6 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar15 = "stats.arenas.0.extents.0.retained_bytes";
            goto LAB_0013cab9;
          }
          local_e18[0] = aVar3;
          local_e08 = aVar11;
          iVar6 = je_mallctlbymib(&sz,header_nonfull_slabs._0_8_,&col_nonfull_slabs,
                                  (size_t *)&col_regs,(void *)0x0,0);
          peVar17 = local_1158;
          if (iVar6 != 0) goto LAB_0013c8c5;
          aVar12.str_val = (char *)(curlextents + lextent_size + col_nonfull_slabs._0_8_);
          aVar18.str_val = (char *)(ndalloc_1 + nmalloc_1 + nrequests_1);
          if (!(bool)(~bVar19 | (char *)aVar18.uint64_val == (char *)0x0)) {
            emitter_table_printf(local_1158,"                     ---\n");
          }
          emitter_json_object_begin(peVar17);
          emitter_json_kv(peVar17,"ndirty",emitter_type_size,&nmalloc_1);
          emitter_json_kv(peVar17,"nmuzzy",emitter_type_size,&ndalloc_1);
          emitter_json_kv(peVar17,"nretained",emitter_type_size,&nrequests_1);
          emitter_json_kv(peVar17,"dirty_bytes",emitter_type_size,&lextent_size);
          emitter_json_kv(peVar17,"muzzy_bytes",emitter_type_size,&curlextents);
          emitter_json_kv(peVar17,"retained_bytes",emitter_type_size,&col_nonfull_slabs);
          emitter_json_object_end(peVar17);
          local_a38 = *(anon_union_8_10_2a69db89_for_emitter_col_s_3 *)
                       (sz_pind2sz_tab + aVar11.uint64_val);
          local_1018.uint64_val = nmalloc_1;
          local_310.field_3.uint64_val = ndalloc_1;
          local_338.field_3.size_val = curlextents;
          local_360.field_3.uint64_val = nrequests_1;
          local_388.field_3 = (anon_union_8_10_2a69db89_for_emitter_col_s_3)col_nonfull_slabs._0_8_;
          col_name.field_3 = aVar11;
          local_3d8.field_3.str_val = aVar12.str_val;
          local_3b0.field_3.str_val = aVar18.str_val;
          if ((char *)aVar18.uint64_val != (char *)0x0) {
            emitter_table_row(peVar17,(emitter_row_t *)&local_748);
          }
          aVar11.str_val = (char *)(aVar11.uint64_val + 1);
          bVar19 = (char *)aVar18.uint64_val == (char *)0x0;
        }
        emitter_json_array_end(local_1158);
        if (bVar19) {
          emitter_table_printf(peVar17,"                     ---\n");
        }
      }
      return;
    }
    sz = 4;
    iVar6 = je_mallctl("arenas.nbins",&col_regs,&sz,(void *)0x0,0);
    if (iVar6 == 0) {
      sz = 4;
      iVar6 = je_mallctl("arenas.nlextents",&header_regs,&sz,(void *)0x0,0);
      if (iVar6 == 0) {
        miblen = 0x1400000001;
        local_1020 = emitter_type_size;
        local_1110 = emitter_type_title;
        local_1108.str_val = "size";
        local_1008 = &col_name;
        col_name.link.qre_prev = (emitter_col_t *)&miblen;
        col_name.justify = emitter_justify_right;
        col_name.width = 4;
        col_name.type = emitter_type_unsigned;
        local_1100 = &local_888;
        local_888.justify = emitter_justify_right;
        local_888.width = 4;
        local_888.field_3.str_val = "ind";
        col_name.link.qre_next = (emitter_col_t *)&miblen_34;
        local_888.link.qre_next = (emitter_col_t *)&sz_35;
        miblen_34 = 0xd00000001;
        sz_35 = 0xd00000001;
        local_fa0.str_val = "allocated";
        local_1010 = (emitter_col_t *)&row;
        local_f98 = &local_1a0;
        row.cols.qlh_first = (anon_struct_8_1_803fbc3e_for_cols)(emitter_col_t *)0xd00000001;
        local_3b0.type = emitter_type_uint64;
        local_1a0.justify = emitter_justify_right;
        local_1a0.width = 0xd;
        local_1a0.field_3.str_val = "nmalloc";
        local_338.link.qre_prev = &local_310;
        local_310.justify = emitter_justify_right;
        local_310.width = 8;
        local_1f0.link.qre_prev = &local_1c8;
        local_1c8.justify = emitter_justify_right;
        local_1c8.width = 8;
        local_1c8.field_3.str_val = "(#/sec)";
        local_360.link.qre_prev = &local_338;
        local_218.link.qre_prev = &local_1f0;
        local_338.justify = emitter_justify_right;
        local_338.width = 0xd;
        local_1f0.justify = emitter_justify_right;
        local_1f0.width = 0xd;
        local_1f0.field_3.str_val = "ndalloc";
        local_388.link.qre_prev = &local_360;
        local_360.justify = emitter_justify_right;
        local_360.width = 8;
        local_240.link.qre_prev = &local_218;
        local_218.justify = emitter_justify_right;
        local_218.width = 8;
        local_218.field_3.str_val = "(#/sec)";
        local_3b0.link.qre_prev = &local_388;
        local_268.link.qre_prev = &local_240;
        local_388.justify = emitter_justify_right;
        local_388.width = 0xd;
        local_240.justify = emitter_justify_right;
        local_240.width = 0xd;
        local_240.field_3.str_val = "nrequests";
        local_3d8.link.qre_prev = &local_3b0;
        local_3b0.justify = emitter_justify_right;
        local_3b0.width = 8;
        local_270 = &local_268;
        local_268.justify = emitter_justify_right;
        local_268.width = 8;
        local_268.field_3.str_val = "(#/sec)";
        local_a28 = &local_3d8;
        local_3d8.justify = emitter_justify_right;
        local_3d8.width = 0xd;
        local_10f8.str_val = (char *)&local_290;
        local_290 = 0xd00000001;
        local_280 = "curlextents";
        sz_1 = 0xe00000001;
        local_fa8 = local_1110;
        local_f90 = local_1100;
        local_a40 = local_1020;
        local_a30 = local_1008;
        local_888.type = local_1110;
        local_888.link.qre_prev = (emitter_col_t *)&sz_1;
        local_748._0_8_ = col_name.link.qre_prev;
        local_3d8.type = local_1020;
        local_3d8.link.qre_next = col_name.link.qre_prev;
        local_3b0.link.qre_next = local_a28;
        local_388.type = local_3b0.type;
        local_388.link.qre_next = local_3d8.link.qre_prev;
        local_360.type = local_3b0.type;
        local_360.link.qre_next = local_3b0.link.qre_prev;
        local_338.type = local_3b0.type;
        local_338.link.qre_next = local_388.link.qre_prev;
        local_310.type = local_3b0.type;
        local_310.link.qre_next = local_360.link.qre_prev;
        local_310.link.qre_prev = local_1010;
        local_288 = local_1110;
        local_278 = (emitter_col_t *)&sz_1;
        local_268.type = local_1110;
        local_268.link.qre_next = (emitter_col_t *)local_10f8.str_val;
        local_240.type = local_1110;
        local_240.link.qre_next = local_270;
        local_218.type = local_1110;
        local_218.link.qre_next = local_268.link.qre_prev;
        local_1f0.type = local_1110;
        local_1f0.link.qre_next = local_240.link.qre_prev;
        local_1c8.type = local_1110;
        local_1c8.link.qre_next = local_218.link.qre_prev;
        local_1c8.link.qre_prev = local_f98;
        local_1a0.type = local_1110;
        local_1a0.link.qre_next = local_1f0.link.qre_prev;
        local_1a0.link.qre_prev = local_888.link.qre_next;
        local_150._0_8_ = (emitter_col_t *)&sz_1;
        emitter_table_printf(peVar17,"large:");
        emitter_table_row(peVar17,(emitter_row_t *)&local_150);
        emitter_json_array_kv_begin(peVar17,"lextents");
        uptime_s_16 = uptime / 1000000000;
        bVar16 = 0;
        for (aVar11.uint64_val = 0; aVar11.uint64_val < (char *)(header_regs._0_8_ & 0xffffffff);
            aVar11.str_val = (char *)(aVar11.uint64_val + 1)) {
          ndalloc_1 = 7;
          nrequests_1 = 8;
          iVar6 = je_mallctlnametomib("stats.arenas.0.lextents.0.nmalloc",&sz,&ndalloc_1);
          if (iVar6 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar15 = "stats.arenas.0.lextents.0.nmalloc";
            goto LAB_0013cab9;
          }
          local_e18[0] = aVar3;
          local_e08 = aVar11;
          iVar6 = je_mallctlbymib(&sz,ndalloc_1,&nmalloc_1,&nrequests_1,(void *)0x0,0);
          if (iVar6 != 0) goto LAB_0013c8c5;
          nrequests_1 = 7;
          lextent_size = 8;
          iVar6 = je_mallctlnametomib("stats.arenas.0.lextents.0.ndalloc",&sz,&nrequests_1);
          if (iVar6 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar15 = "stats.arenas.0.lextents.0.ndalloc";
            goto LAB_0013cab9;
          }
          local_e18[0] = aVar3;
          local_e08 = aVar11;
          iVar6 = je_mallctlbymib(&sz,nrequests_1,&ndalloc_1,&lextent_size,(void *)0x0,0);
          if (iVar6 != 0) goto LAB_0013c8c5;
          lextent_size = 7;
          curlextents = 8;
          iVar6 = je_mallctlnametomib("stats.arenas.0.lextents.0.nrequests",&sz,&lextent_size);
          if (iVar6 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar15 = "stats.arenas.0.lextents.0.nrequests";
            goto LAB_0013cab9;
          }
          local_e18[0] = aVar3;
          local_e08 = aVar11;
          iVar6 = je_mallctlbymib(&sz,lextent_size,&nrequests_1,&curlextents,(void *)0x0,0);
          if (iVar6 != 0) goto LAB_0013c8c5;
          uptime_s = nrequests_1;
          bVar19 = nrequests_1 == 0;
          if ((~bVar16 & 1) == 0 && !bVar19) {
            emitter_table_printf(local_1158,"                     ---\n");
          }
          curlextents = 7;
          col_nonfull_slabs.justify = 8;
          col_nonfull_slabs.width = 0;
          iVar6 = je_mallctlnametomib("arenas.lextent.0.size",&sz,&curlextents);
          if (iVar6 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar15 = "arenas.lextent.0.size";
            goto LAB_0013cab9;
          }
          local_e18[0] = aVar11;
          iVar6 = je_mallctlbymib(&sz,curlextents,&lextent_size,(size_t *)&col_nonfull_slabs,
                                  (void *)0x0,0);
          if (iVar6 != 0) goto LAB_0013c8c5;
          col_nonfull_slabs.justify = 7;
          col_nonfull_slabs.width = 0;
          header_nonfull_slabs.justify = 8;
          header_nonfull_slabs.width = 0;
          iVar6 = je_mallctlnametomib("stats.arenas.0.lextents.0.curlextents",&sz,
                                      (size_t *)&col_nonfull_slabs);
          if (iVar6 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar15 = "stats.arenas.0.lextents.0.curlextents";
            goto LAB_0013cab9;
          }
          local_1124 = CONCAT31(local_1124._1_3_,bVar19);
          local_e18[0] = aVar3;
          local_e08 = aVar11;
          iVar6 = je_mallctlbymib(&sz,col_nonfull_slabs._0_8_,&curlextents,
                                  (size_t *)&header_nonfull_slabs,(void *)0x0,0);
          peVar17 = local_1158;
          if (iVar6 != 0) goto LAB_0013c8c5;
          emitter_json_object_begin(local_1158);
          emitter_json_kv(peVar17,"curlextents",emitter_type_size,&curlextents);
          emitter_json_object_end(peVar17);
          peVar17 = local_1158;
          local_1018.uint64_val = curlextents * lextent_size;
          local_a38.size_val = lextent_size;
          col_name.field_3.int_val = col_regs.justify + aVar11.int_val;
          local_310.field_3.uint64_val = nmalloc_1;
          if (uptime == 0) {
            local_310.field_3.uint64_val = 0;
          }
          if (nmalloc_1 != 0 && 999999999 < uptime) {
            local_310.field_3.uint64_val = nmalloc_1 / uptime_s_16;
          }
          local_338.field_3.uint64_val = ndalloc_1;
          local_360.field_3.uint64_val = ndalloc_1;
          if (uptime == 0) {
            local_360.field_3.uint64_val = 0;
          }
          if (ndalloc_1 != 0 && 999999999 < uptime) {
            local_360.field_3.uint64_val = ndalloc_1 / uptime_s_16;
          }
          local_388.field_3.uint64_val = nrequests_1;
          local_3b0.field_3.uint64_val = nrequests_1;
          if (uptime == 0) {
            local_3b0.field_3.uint64_val = 0;
          }
          if (nrequests_1 != 0 && 999999999 < uptime) {
            local_3b0.field_3.uint64_val = nrequests_1 / uptime_s_16;
          }
          local_3d8.field_3.size_val = curlextents;
          if (uptime_s != 0) {
            emitter_table_row(local_1158,(emitter_row_t *)&local_748);
          }
          bVar16 = (byte)local_1124;
        }
        emitter_json_array_end(peVar17);
        if ((bVar16 & 1) != 0) {
          emitter_table_printf(peVar17,"                     ---\n");
        }
        goto LAB_0013c13e;
      }
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar15 = "arenas.nlextents";
      goto LAB_0013cab9;
    }
  }
  else {
    sz = 8;
    iVar6 = je_mallctl("arenas.page",&page_1,&sz,(void *)0x0,0);
    if (iVar6 != 0) goto LAB_0013cac5;
    sz = 4;
    iVar6 = je_mallctl("arenas.nbins",&nbins,&sz,(void *)0x0,0);
    if (iVar6 == 0) {
      local_888.justify = emitter_justify_right;
      local_888.width = 0x14;
      local_888.type = emitter_type_size;
      miblen_34 = 0x1400000001;
      local_1020 = emitter_type_title;
      local_1018.str_val = "size";
      local_1a0.link.qre_prev = (emitter_col_t *)&sz_35;
      local_f90 = &local_888;
      local_888.link.qre_next = local_1a0.link.qre_prev;
      sz_35 = 0x400000001;
      local_fa8 = emitter_type_unsigned;
      local_1010 = (emitter_col_t *)&row;
      row.cols.qlh_first = (anon_struct_8_1_803fbc3e_for_cols)(emitter_col_t *)0x400000001;
      local_1c8.link.qre_prev = &local_1a0;
      local_f98 = local_1c8.link.qre_prev;
      local_1a0.justify = emitter_justify_right;
      local_1a0.width = 0xd;
      local_288 = emitter_type_uint64;
      local_310.link.qre_prev = local_1010;
      local_310.justify = emitter_justify_right;
      local_310.width = 0xd;
      local_310.type = emitter_type_title;
      local_310.field_3.str_val = "allocated";
      local_1f0.link.qre_prev = &local_1c8;
      local_1c8.justify = emitter_justify_right;
      local_1c8.width = 0xd;
      local_338.link.qre_prev = &local_310;
      local_310.link.qre_next = &local_338;
      local_338.justify = emitter_justify_right;
      local_338.width = 0xd;
      local_338.type = emitter_type_title;
      local_338.field_3.str_val = "nmalloc";
      local_218.link.qre_prev = &local_1f0;
      local_1f0.justify = emitter_justify_right;
      local_1f0.width = 8;
      local_360.link.qre_prev = &local_338;
      local_338.link.qre_next = &local_360;
      local_360.justify = emitter_justify_right;
      local_360.width = 8;
      local_360.type = emitter_type_title;
      local_360.field_3 = (anon_union_8_10_2a69db89_for_emitter_col_s_3)0x141c27;
      local_240.link.qre_prev = &local_218;
      local_218.justify = emitter_justify_right;
      local_218.width = 0xd;
      local_388.link.qre_prev = &local_360;
      local_360.link.qre_next = &local_388;
      local_388.justify = emitter_justify_right;
      local_388.width = 0xd;
      local_388.type = emitter_type_title;
      local_388.field_3.str_val = "ndalloc";
      local_268.link.qre_prev = &local_240;
      local_240.justify = emitter_justify_right;
      local_240.width = 8;
      local_3b0.link.qre_prev = &local_388;
      local_388.link.qre_next = &local_3b0;
      local_3b0.justify = emitter_justify_right;
      local_3b0.width = 8;
      local_3b0.type = emitter_type_title;
      local_3b0.field_3.str_val = "(#/sec)";
      local_270 = &local_268;
      local_268.justify = emitter_justify_right;
      local_268.width = 0xd;
      local_150.link.qre_prev = &local_3d8;
      local_3d8.link.qre_prev = &local_3b0;
      local_3b0.link.qre_next = local_150.link.qre_prev;
      local_3d8.justify = emitter_justify_right;
      local_3d8.width = 0xd;
      local_3d8.type = emitter_type_title;
      local_3d8.field_3.str_val = "nrequests";
      local_268.link.qre_next = (emitter_col_t *)&local_290;
      local_3d8.link.qre_next = &local_150;
      local_290 = 0xa00000001;
      local_150._0_8_ = (emitter_col_t *)0xa00000001;
      local_278 = &local_748;
      local_748.link.qre_prev = local_268.link.qre_next;
      local_150.field_3.str_val = "(#/sec)";
      local_748._0_8_ = (emitter_col_t *)0x900000001;
      local_748.type = emitter_type_unsigned;
      local_150.link.qre_next = (emitter_col_t *)&nmalloc_1;
      local_818 = &local_150;
      nmalloc_1 = 0x900000001;
      local_830 = emitter_type_title;
      local_828.str_val = "nshards";
      local_c50 = local_278;
      local_748.link.qre_next = (emitter_col_t *)&ndalloc_1;
      local_e30 = local_150.link.qre_next;
      local_e38 = (emitter_col_t *)&miblen_34;
      local_820 = (emitter_col_t *)&nrequests_1;
      nrequests_1 = 0xd00000001;
      local_e48 = emitter_type_title;
      local_e40.str_val = "curregs";
      ndalloc_1 = 0xd00000001;
      local_c68 = emitter_type_size;
      local_f40 = (emitter_col_t *)&ndalloc_1;
      local_f48 = &local_888;
      local_c58 = (emitter_col_t *)&lextent_size;
      local_888.link.qre_prev = (emitter_col_t *)&lextent_size;
      lextent_size = 0xd00000001;
      local_f58 = emitter_type_size;
      local_e38 = (emitter_col_t *)&curlextents;
      local_e58 = (emitter_col_t *)&nrequests_1;
      local_e60 = (emitter_col_t *)&miblen_34;
      local_1008 = local_e38;
      curlextents = 0xd00000001;
      local_e70 = emitter_type_title;
      local_e68.str_val = "curslabs";
      col_nonfull_slabs.link.qre_next = &col_nonfull_slabs;
      col_nonfull_slabs.link.qre_prev = &col_nonfull_slabs;
      if (&local_888 != (emitter_col_t *)0x0) {
        local_888.link.qre_prev = &col_nonfull_slabs;
        col_nonfull_slabs.link.qre_prev = (emitter_col_t *)&lextent_size;
        col_nonfull_slabs.link.qre_next = &local_888;
      }
      col_nonfull_slabs.justify = emitter_justify_right;
      col_nonfull_slabs.width = 0xf;
      col_nonfull_slabs.type = emitter_type_size;
      header_nonfull_slabs.link.qre_next = &header_nonfull_slabs;
      header_nonfull_slabs.link.qre_prev = &header_nonfull_slabs;
      if ((emitter_col_t *)&miblen_34 != (emitter_col_t *)0x0) {
        local_1008 = &header_nonfull_slabs;
        header_nonfull_slabs.link.qre_prev = local_e38;
        header_nonfull_slabs.link.qre_next = (emitter_col_t *)&miblen_34;
      }
      peVar8 = header_nonfull_slabs.link.qre_next;
      header_nonfull_slabs.justify = emitter_justify_right;
      header_nonfull_slabs.width = 0xf;
      header_nonfull_slabs.type = emitter_type_title;
      header_nonfull_slabs.field_3.str_val = "nonfull_slabs";
      col_regs.link.qre_next = &col_regs;
      col_regs.link.qre_prev = &col_regs;
      if (col_nonfull_slabs.link.qre_next != (emitter_col_t *)0x0) {
        col_regs.link.qre_prev = ((col_nonfull_slabs.link.qre_next)->link).qre_prev;
        col_regs.link.qre_next = col_nonfull_slabs.link.qre_next;
        ((col_regs.link.qre_prev)->link).qre_next = &col_regs;
        ((col_nonfull_slabs.link.qre_next)->link).qre_prev = &col_regs;
      }
      peVar5 = col_regs.link.qre_next;
      col_regs.justify = emitter_justify_right;
      col_regs.width = 5;
      col_regs.type = emitter_type_unsigned;
      header_regs.link.qre_next = &header_regs;
      header_regs.link.qre_prev = &header_regs;
      peVar13 = &header_regs;
      if (peVar8 != (emitter_col_t *)0x0) {
        header_regs.link.qre_prev = (peVar8->link).qre_prev;
        header_regs.link.qre_next = peVar8;
        ((header_regs.link.qre_prev)->link).qre_next = &header_regs;
        (peVar8->link).qre_prev = &header_regs;
        peVar13 = peVar8;
      }
      header_regs.justify = emitter_justify_right;
      header_regs.width = 5;
      header_regs.type = emitter_type_title;
      header_regs.field_3.str_val = "regs";
      col_pgs.link.qre_next = &col_pgs;
      col_pgs.link.qre_prev = &col_pgs;
      if (col_regs.link.qre_next != (emitter_col_t *)0x0) {
        col_pgs.link.qre_prev = ((col_regs.link.qre_next)->link).qre_prev;
        col_pgs.link.qre_next = col_regs.link.qre_next;
        ((col_pgs.link.qre_prev)->link).qre_next = &col_pgs;
        ((col_regs.link.qre_next)->link).qre_prev = &col_pgs;
        col_pgs.link.qre_next = peVar5;
      }
      col_pgs.justify = emitter_justify_right;
      col_pgs.width = 4;
      col_pgs.type = emitter_type_size;
      header_pgs.link.qre_next = &header_pgs;
      header_pgs.link.qre_prev = &header_pgs;
      peVar8 = &header_pgs;
      header_regs.link.qre_next = peVar13;
      if (peVar13 != (emitter_col_t *)0x0) {
        header_pgs.link.qre_prev = (peVar13->link).qre_prev;
        header_pgs.link.qre_next = peVar13;
        ((header_pgs.link.qre_prev)->link).qre_next = &header_pgs;
        (peVar13->link).qre_prev = &header_pgs;
        peVar8 = peVar13;
      }
      header_pgs.justify = emitter_justify_right;
      header_pgs.width = 4;
      header_pgs.type = emitter_type_title;
      header_pgs.field_3.str_val = "pgs";
      col_justify_spacer.link.qre_next = &col_justify_spacer;
      col_justify_spacer.link.qre_prev = &col_justify_spacer;
      header_pgs.link.qre_next = peVar8;
      if (col_pgs.link.qre_next != (emitter_col_t *)0x0) {
        col_justify_spacer.link.qre_prev = ((col_pgs.link.qre_next)->link).qre_prev;
        col_justify_spacer.link.qre_next = col_pgs.link.qre_next;
        ((col_justify_spacer.link.qre_prev)->link).qre_next = &col_justify_spacer;
        ((col_pgs.link.qre_next)->link).qre_prev = &col_justify_spacer;
      }
      peVar5 = col_justify_spacer.link.qre_next;
      col_justify_spacer.justify = emitter_justify_right;
      col_justify_spacer.width = 1;
      col_justify_spacer.type = emitter_type_title;
      header_justify_spacer.link.qre_next = &header_justify_spacer;
      header_justify_spacer.link.qre_prev = &header_justify_spacer;
      if (peVar8 != (emitter_col_t *)0x0) {
        header_justify_spacer.link.qre_prev = (peVar8->link).qre_prev;
        header_justify_spacer.link.qre_next = peVar8;
        ((header_justify_spacer.link.qre_prev)->link).qre_next = &header_justify_spacer;
        (peVar8->link).qre_prev = &header_justify_spacer;
      }
      peVar8 = header_justify_spacer.link.qre_next;
      header_justify_spacer.justify = emitter_justify_right;
      header_justify_spacer.width = 1;
      header_justify_spacer.type = emitter_type_title;
      header_justify_spacer.field_3.str_val = "justify_spacer";
      col_util.link.qre_next = &col_util;
      col_util.link.qre_prev = &col_util;
      if (peVar5 != (emitter_col_t *)0x0) {
        col_util.link.qre_prev = (peVar5->link).qre_prev;
        col_util.link.qre_next = peVar5;
        ((col_util.link.qre_prev)->link).qre_next = &col_util;
        (peVar5->link).qre_prev = &col_util;
      }
      peVar5 = col_util.link.qre_next;
      col_util.justify = emitter_justify_right;
      col_util.width = 6;
      col_util.type = emitter_type_title;
      header_util.link.qre_next = &header_util;
      header_util.link.qre_prev = &header_util;
      if (peVar8 != (emitter_col_t *)0x0) {
        header_util.link.qre_prev = (peVar8->link).qre_prev;
        header_util.link.qre_next = peVar8;
        ((header_util.link.qre_prev)->link).qre_next = &header_util;
        (peVar8->link).qre_prev = &header_util;
      }
      peVar8 = header_util.link.qre_next;
      header_util.justify = emitter_justify_right;
      header_util.width = 6;
      header_util.type = emitter_type_title;
      header_util.field_3.str_val = "util";
      col_nfills.link.qre_next = &col_nfills;
      col_nfills.link.qre_prev = &col_nfills;
      if (peVar5 != (emitter_col_t *)0x0) {
        col_nfills.link.qre_prev = (peVar5->link).qre_prev;
        col_nfills.link.qre_next = peVar5;
        ((col_nfills.link.qre_prev)->link).qre_next = &col_nfills;
        (peVar5->link).qre_prev = &col_nfills;
      }
      peVar5 = col_nfills.link.qre_next;
      col_nfills.justify = emitter_justify_right;
      col_nfills.width = 0xd;
      col_nfills.type = emitter_type_uint64;
      header_nfills.link.qre_next = &header_nfills;
      header_nfills.link.qre_prev = &header_nfills;
      if (peVar8 != (emitter_col_t *)0x0) {
        header_nfills.link.qre_prev = (peVar8->link).qre_prev;
        header_nfills.link.qre_next = peVar8;
        ((header_nfills.link.qre_prev)->link).qre_next = &header_nfills;
        (peVar8->link).qre_prev = &header_nfills;
      }
      peVar8 = header_nfills.link.qre_next;
      header_nfills.justify = emitter_justify_right;
      header_nfills.width = 0xd;
      header_nfills.type = emitter_type_title;
      header_nfills.field_3.str_val = "nfills";
      col_nfills_ps.link.qre_next = &col_nfills_ps;
      col_nfills_ps.link.qre_prev = &col_nfills_ps;
      if (peVar5 != (emitter_col_t *)0x0) {
        col_nfills_ps.link.qre_prev = (peVar5->link).qre_prev;
        col_nfills_ps.link.qre_next = peVar5;
        ((col_nfills_ps.link.qre_prev)->link).qre_next = &col_nfills_ps;
        (peVar5->link).qre_prev = &col_nfills_ps;
      }
      peVar5 = col_nfills_ps.link.qre_next;
      col_nfills_ps.justify = emitter_justify_right;
      col_nfills_ps.width = 8;
      col_nfills_ps.type = emitter_type_uint64;
      header_nfills_ps.link.qre_next = &header_nfills_ps;
      header_nfills_ps.link.qre_prev = &header_nfills_ps;
      if (peVar8 != (emitter_col_t *)0x0) {
        header_nfills_ps.link.qre_prev = (peVar8->link).qre_prev;
        header_nfills_ps.link.qre_next = peVar8;
        ((header_nfills_ps.link.qre_prev)->link).qre_next = &header_nfills_ps;
        (peVar8->link).qre_prev = &header_nfills_ps;
      }
      peVar8 = header_nfills_ps.link.qre_next;
      header_nfills_ps.justify = emitter_justify_right;
      header_nfills_ps.width = 8;
      header_nfills_ps.type = emitter_type_title;
      header_nfills_ps.field_3.str_val = "(#/sec)";
      col_nflushes.link.qre_next = &col_nflushes;
      col_nflushes.link.qre_prev = &col_nflushes;
      if (peVar5 != (emitter_col_t *)0x0) {
        col_nflushes.link.qre_prev = (peVar5->link).qre_prev;
        col_nflushes.link.qre_next = peVar5;
        ((col_nflushes.link.qre_prev)->link).qre_next = &col_nflushes;
        (peVar5->link).qre_prev = &col_nflushes;
      }
      peVar5 = col_nflushes.link.qre_next;
      col_nflushes.justify = emitter_justify_right;
      col_nflushes.width = 0xd;
      col_nflushes.type = emitter_type_uint64;
      header_nflushes.link.qre_next = &header_nflushes;
      header_nflushes.link.qre_prev = &header_nflushes;
      if (peVar8 != (emitter_col_t *)0x0) {
        header_nflushes.link.qre_prev = (peVar8->link).qre_prev;
        header_nflushes.link.qre_next = peVar8;
        ((header_nflushes.link.qre_prev)->link).qre_next = &header_nflushes;
        (peVar8->link).qre_prev = &header_nflushes;
      }
      peVar8 = header_nflushes.link.qre_next;
      header_nflushes.justify = emitter_justify_right;
      header_nflushes.width = 0xd;
      header_nflushes.type = emitter_type_title;
      header_nflushes.field_3.str_val = "nflushes";
      col_nflushes_ps.link.qre_next = &col_nflushes_ps;
      col_nflushes_ps.link.qre_prev = &col_nflushes_ps;
      if (peVar5 != (emitter_col_t *)0x0) {
        col_nflushes_ps.link.qre_prev = (peVar5->link).qre_prev;
        col_nflushes_ps.link.qre_next = peVar5;
        ((col_nflushes_ps.link.qre_prev)->link).qre_next = &col_nflushes_ps;
        (peVar5->link).qre_prev = &col_nflushes_ps;
      }
      peVar5 = col_nflushes_ps.link.qre_next;
      col_nflushes_ps.justify = emitter_justify_right;
      col_nflushes_ps.width = 8;
      col_nflushes_ps.type = emitter_type_uint64;
      header_nflushes_ps.link.qre_next = &header_nflushes_ps;
      header_nflushes_ps.link.qre_prev = &header_nflushes_ps;
      if (peVar8 != (emitter_col_t *)0x0) {
        header_nflushes_ps.link.qre_prev = (peVar8->link).qre_prev;
        header_nflushes_ps.link.qre_next = peVar8;
        ((header_nflushes_ps.link.qre_prev)->link).qre_next = &header_nflushes_ps;
        (peVar8->link).qre_prev = &header_nflushes_ps;
      }
      peVar8 = header_nflushes_ps.link.qre_next;
      header_nflushes_ps.justify = emitter_justify_right;
      header_nflushes_ps.width = 8;
      header_nflushes_ps.type = emitter_type_title;
      header_nflushes_ps.field_3.str_val = "(#/sec)";
      col_nslabs.link.qre_next = &col_nslabs;
      col_nslabs.link.qre_prev = &col_nslabs;
      if (peVar5 != (emitter_col_t *)0x0) {
        col_nslabs.link.qre_prev = (peVar5->link).qre_prev;
        col_nslabs.link.qre_next = peVar5;
        ((col_nslabs.link.qre_prev)->link).qre_next = &col_nslabs;
        (peVar5->link).qre_prev = &col_nslabs;
      }
      peVar5 = col_nslabs.link.qre_next;
      col_nslabs.justify = emitter_justify_right;
      col_nslabs.width = 0xd;
      col_nslabs.type = emitter_type_uint64;
      header_nslabs.link.qre_next = &header_nslabs;
      header_nslabs.link.qre_prev = &header_nslabs;
      if (peVar8 != (emitter_col_t *)0x0) {
        header_nslabs.link.qre_prev = (peVar8->link).qre_prev;
        header_nslabs.link.qre_next = peVar8;
        ((header_nslabs.link.qre_prev)->link).qre_next = &header_nslabs;
        (peVar8->link).qre_prev = &header_nslabs;
      }
      peVar8 = header_nslabs.link.qre_next;
      header_nslabs.justify = emitter_justify_right;
      header_nslabs.width = 0xd;
      header_nslabs.type = emitter_type_title;
      header_nslabs.field_3.str_val = "nslabs";
      col_nreslabs.link.qre_next = &col_nreslabs;
      col_nreslabs.link.qre_prev = &col_nreslabs;
      if (peVar5 != (emitter_col_t *)0x0) {
        col_nreslabs.link.qre_prev = (peVar5->link).qre_prev;
        col_nreslabs.link.qre_next = peVar5;
        ((col_nreslabs.link.qre_prev)->link).qre_next = &col_nreslabs;
        (peVar5->link).qre_prev = &col_nreslabs;
      }
      peVar5 = col_nreslabs.link.qre_next;
      col_nreslabs.justify = emitter_justify_right;
      col_nreslabs.width = 0xd;
      col_nreslabs.type = emitter_type_uint64;
      header_nreslabs.link.qre_next = &header_nreslabs;
      header_nreslabs.link.qre_prev = &header_nreslabs;
      if (peVar8 != (emitter_col_t *)0x0) {
        header_nreslabs.link.qre_prev = (peVar8->link).qre_prev;
        header_nreslabs.link.qre_next = peVar8;
        ((header_nreslabs.link.qre_prev)->link).qre_next = &header_nreslabs;
        (peVar8->link).qre_prev = &header_nreslabs;
      }
      peVar8 = header_nreslabs.link.qre_next;
      header_nreslabs.justify = emitter_justify_right;
      header_nreslabs.width = 0xd;
      header_nreslabs.type = emitter_type_title;
      header_nreslabs.field_3.str_val = "nreslabs";
      col_nreslabs_ps.link.qre_next = &col_nreslabs_ps;
      col_nreslabs_ps.link.qre_prev = &col_nreslabs_ps;
      if (peVar5 != (emitter_col_t *)0x0) {
        col_nreslabs_ps.link.qre_prev = (peVar5->link).qre_prev;
        col_nreslabs_ps.link.qre_next = peVar5;
        ((col_nreslabs_ps.link.qre_prev)->link).qre_next = &col_nreslabs_ps;
        (peVar5->link).qre_prev = &col_nreslabs_ps;
      }
      local_1140.cols.qlh_first =
           (anon_struct_8_1_803fbc3e_for_cols)
           (anon_struct_8_1_803fbc3e_for_cols)col_nreslabs_ps.link.qre_next;
      col_nreslabs_ps.justify = emitter_justify_right;
      col_nreslabs_ps.width = 8;
      col_nreslabs_ps.type = emitter_type_uint64;
      header_nreslabs_ps.link.qre_next = &header_nreslabs_ps;
      header_nreslabs_ps.link.qre_prev = &header_nreslabs_ps;
      if (peVar8 != (emitter_col_t *)0x0) {
        header_nreslabs_ps.link.qre_prev = (peVar8->link).qre_prev;
        ((header_nreslabs_ps.link.qre_prev)->link).qre_next = &header_nreslabs_ps;
        header_nreslabs_ps.link.qre_next = peVar8;
        (peVar8->link).qre_prev = &header_nreslabs_ps;
      }
      header_nreslabs_ps.justify = emitter_justify_right;
      header_nreslabs_ps.width = 8;
      header_nreslabs_ps.type = emitter_type_title;
      header_nreslabs_ps.field_3.str_val = "(#/sec)";
      header_justify_spacer.field_3.str_val = " ";
      col_justify_spacer.field_3.str_val = " ";
      local_1138.cols.qlh_first =
           (anon_struct_8_1_803fbc3e_for_cols)
           (anon_struct_8_1_803fbc3e_for_cols)header_nreslabs_ps.link.qre_next;
      local_268.type = local_288;
      local_240.type = local_288;
      local_240.link.qre_next = local_270;
      local_218.type = local_288;
      local_218.link.qre_next = local_268.link.qre_prev;
      local_1f0.type = local_288;
      local_1f0.link.qre_next = local_240.link.qre_prev;
      local_1c8.type = local_288;
      local_1c8.link.qre_next = local_218.link.qre_prev;
      local_1a0.type = local_288;
      local_1a0.link.qre_next = local_1f0.link.qre_prev;
      local_150.type = local_1020;
      if ((char)uptime_s_16 == '\0') {
        iVar6 = 0xf;
      }
      else {
        mutex_stats_init_cols
                  (&local_1140,(char *)0x0,(emitter_col_t *)0x0,(emitter_col_t *)&sz,col_mutex32);
        mutex_stats_init_cols
                  (&local_1138,(char *)0x0,(emitter_col_t *)0x0,(emitter_col_t *)&miblen,
                   header_mutex32);
        iVar6 = miblen_34._4_4_ + -5;
      }
      miblen_34 = CONCAT44(iVar6,(undefined4)miblen_34);
      emitter_table_printf(peVar17,"bins:");
      emitter_table_row(peVar17,&local_1138);
      emitter_json_array_kv_begin(peVar17,"bins");
      uptime_s = uVar4 / 1000000000;
      bVar16 = 0;
      for (aVar11.uint64_val = 0; peVar17 = local_1158, aVar11.uint64_val < (char *)(ulong)nbins;
          aVar11.str_val = (char *)(aVar11.uint64_val + 1)) {
        col_name.justify = 7;
        col_name.width = 0;
        sz_43 = 8;
        iVar6 = je_mallctlnametomib("stats.arenas.0.bins.0.nslabs",&sz_1,(size_t *)&col_name);
        if (iVar6 != 0) {
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar15 = "stats.arenas.0.bins.0.nslabs";
          goto LAB_0013cab9;
        }
        local_1108 = aVar3;
        local_10f8 = aVar11;
        iVar6 = je_mallctlbymib(&sz_1,col_name._0_8_,&nslabs,&sz_43,(void *)0x0,0);
        peVar17 = local_1158;
        if (iVar6 != 0) goto LAB_0013c8c5;
        local_1124 = CONCAT31(local_1124._1_3_,nslabs == 0);
        if ((~bVar16 & 1) == 0 && nslabs != 0) {
          emitter_table_printf(local_1158,"                     ---\n");
        }
        col_name.justify = 7;
        col_name.width = 0;
        sz_43 = 8;
        iVar6 = je_mallctlnametomib("arenas.bin.0.size",&sz_1,(size_t *)&col_name);
        if (iVar6 != 0) {
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar15 = "arenas.bin.0.size";
          goto LAB_0013cab9;
        }
        local_1108 = aVar11;
        iVar6 = je_mallctlbymib(&sz_1,col_name._0_8_,&reg_size,&sz_43,(void *)0x0,0);
        if (iVar6 != 0) goto LAB_0013c8c5;
        col_name.justify = 7;
        col_name.width = 0;
        sz_43 = 4;
        iVar6 = je_mallctlnametomib("arenas.bin.0.nregs",&sz_1,(size_t *)&col_name);
        if (iVar6 != 0) {
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar15 = "arenas.bin.0.nregs";
          goto LAB_0013cab9;
        }
        local_1108 = aVar11;
        iVar6 = je_mallctlbymib(&sz_1,col_name._0_8_,&nregs,&sz_43,(void *)0x0,0);
        if (iVar6 != 0) goto LAB_0013c8c5;
        col_name.justify = 7;
        col_name.width = 0;
        sz_43 = 8;
        iVar6 = je_mallctlnametomib("arenas.bin.0.slab_size",&sz_1,(size_t *)&col_name);
        if (iVar6 != 0) {
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar15 = "arenas.bin.0.slab_size";
          goto LAB_0013cab9;
        }
        local_1108 = aVar11;
        iVar6 = je_mallctlbymib(&sz_1,col_name._0_8_,&slab_size,&sz_43,(void *)0x0,0);
        if (iVar6 != 0) goto LAB_0013c8c5;
        col_name.justify = 7;
        col_name.width = 0;
        sz_43 = 4;
        iVar6 = je_mallctlnametomib("arenas.bin.0.nshards",&sz_1,(size_t *)&col_name);
        if (iVar6 != 0) {
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar15 = "arenas.bin.0.nshards";
          goto LAB_0013cab9;
        }
        local_1108 = aVar11;
        iVar6 = je_mallctlbymib(&sz_1,col_name._0_8_,&nshards,&sz_43,(void *)0x0,0);
        if (iVar6 != 0) goto LAB_0013c8c5;
        col_name.justify = 7;
        col_name.width = 0;
        sz_43 = 8;
        iVar6 = je_mallctlnametomib("stats.arenas.0.bins.0.nmalloc",&sz_1,(size_t *)&col_name);
        if (iVar6 != 0) {
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar15 = "stats.arenas.0.bins.0.nmalloc";
          goto LAB_0013cab9;
        }
        local_1108 = aVar3;
        local_10f8 = aVar11;
        iVar6 = je_mallctlbymib(&sz_1,col_name._0_8_,&nmalloc,&sz_43,(void *)0x0,0);
        if (iVar6 != 0) goto LAB_0013c8c5;
        col_name.justify = 7;
        col_name.width = 0;
        sz_43 = 8;
        iVar6 = je_mallctlnametomib("stats.arenas.0.bins.0.ndalloc",&sz_1,(size_t *)&col_name);
        if (iVar6 != 0) {
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar15 = "stats.arenas.0.bins.0.ndalloc";
          goto LAB_0013cab9;
        }
        local_1108 = aVar3;
        local_10f8 = aVar11;
        iVar6 = je_mallctlbymib(&sz_1,col_name._0_8_,&ndalloc,&sz_43,(void *)0x0,0);
        if (iVar6 != 0) goto LAB_0013c8c5;
        col_name.justify = 7;
        col_name.width = 0;
        sz_43 = 8;
        iVar6 = je_mallctlnametomib("stats.arenas.0.bins.0.curregs",&sz_1,(size_t *)&col_name);
        if (iVar6 != 0) {
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar15 = "stats.arenas.0.bins.0.curregs";
          goto LAB_0013cab9;
        }
        local_1108 = aVar3;
        local_10f8 = aVar11;
        iVar6 = je_mallctlbymib(&sz_1,col_name._0_8_,&curregs,&sz_43,(void *)0x0,0);
        if (iVar6 != 0) goto LAB_0013c8c5;
        col_name.justify = 7;
        col_name.width = 0;
        sz_43 = 8;
        iVar6 = je_mallctlnametomib("stats.arenas.0.bins.0.nrequests",&sz_1,(size_t *)&col_name);
        if (iVar6 != 0) {
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar15 = "stats.arenas.0.bins.0.nrequests";
          goto LAB_0013cab9;
        }
        local_1108 = aVar3;
        local_10f8 = aVar11;
        iVar6 = je_mallctlbymib(&sz_1,col_name._0_8_,&nrequests,&sz_43,(void *)0x0,0);
        if (iVar6 != 0) goto LAB_0013c8c5;
        col_name.justify = 7;
        col_name.width = 0;
        sz_43 = 8;
        iVar6 = je_mallctlnametomib("stats.arenas.0.bins.0.nfills",&sz_1,(size_t *)&col_name);
        if (iVar6 != 0) {
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar15 = "stats.arenas.0.bins.0.nfills";
          goto LAB_0013cab9;
        }
        local_1108 = aVar3;
        local_10f8 = aVar11;
        iVar6 = je_mallctlbymib(&sz_1,col_name._0_8_,&nfills,&sz_43,(void *)0x0,0);
        if (iVar6 != 0) goto LAB_0013c8c5;
        col_name.justify = 7;
        col_name.width = 0;
        sz_43 = 8;
        iVar6 = je_mallctlnametomib("stats.arenas.0.bins.0.nflushes",&sz_1,(size_t *)&col_name);
        if (iVar6 != 0) {
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar15 = "stats.arenas.0.bins.0.nflushes";
          goto LAB_0013cab9;
        }
        local_1108 = aVar3;
        local_10f8 = aVar11;
        iVar6 = je_mallctlbymib(&sz_1,col_name._0_8_,&nflushes,&sz_43,(void *)0x0,0);
        if (iVar6 != 0) goto LAB_0013c8c5;
        col_name.justify = 7;
        col_name.width = 0;
        sz_43 = 8;
        iVar6 = je_mallctlnametomib("stats.arenas.0.bins.0.nreslabs",&sz_1,(size_t *)&col_name);
        if (iVar6 != 0) {
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar15 = "stats.arenas.0.bins.0.nreslabs";
          goto LAB_0013cab9;
        }
        local_1108 = aVar3;
        local_10f8 = aVar11;
        iVar6 = je_mallctlbymib(&sz_1,col_name._0_8_,&nreslabs,&sz_43,(void *)0x0,0);
        if (iVar6 != 0) goto LAB_0013c8c5;
        col_name.justify = 7;
        col_name.width = 0;
        sz_43 = 8;
        iVar6 = je_mallctlnametomib("stats.arenas.0.bins.0.curslabs",&sz_1,(size_t *)&col_name);
        if (iVar6 != 0) {
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar15 = "stats.arenas.0.bins.0.curslabs";
          goto LAB_0013cab9;
        }
        local_1108 = aVar3;
        local_10f8 = aVar11;
        iVar6 = je_mallctlbymib(&sz_1,col_name._0_8_,&curslabs,&sz_43,(void *)0x0,0);
        if (iVar6 != 0) goto LAB_0013c8c5;
        col_name.justify = 7;
        col_name.width = 0;
        sz_43 = 8;
        iVar6 = je_mallctlnametomib("stats.arenas.0.bins.0.nonfull_slabs",&sz_1,(size_t *)&col_name)
        ;
        if (iVar6 != 0) {
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar15 = "stats.arenas.0.bins.0.nonfull_slabs";
          goto LAB_0013cab9;
        }
        pcVar15 = (char *)0x0;
        local_1108 = aVar3;
        local_10f8 = aVar11;
        iVar6 = je_mallctlbymib(&sz_1,col_name._0_8_,&nonfull_slabs,&sz_43,(void *)0x0,0);
        if (iVar6 != 0) goto LAB_0013c8c5;
        if ((char)uptime_s_16 != '\0') {
          local_e20 = emitter_type_uint64;
          gen_mutex_ctl_str((char *)&sz_1,0x142271,"mutex","num_ops",pcVar15);
          sz_43 = 7;
          sz_57 = 8;
          iVar6 = je_mallctlnametomib((char *)&sz_1,(size_t *)&col_name,&sz_43);
          if (iVar6 == 0) {
            pcVar15 = (char *)0x0;
            col_name.field_3 = aVar3;
            col_name.link.qre_prev = (emitter_col_t *)aVar11;
            iVar6 = je_mallctlbymib((size_t *)&col_name,sz_43,local_e18,&sz_57,(void *)0x0,0);
            if (iVar6 != 0) goto LAB_0013c8c5;
            local_df8 = 4;
            local_df0 = local_e18[0];
            if (uVar4 == 0) {
              local_df0.uint64_val = 0;
            }
            if ((char *)local_e18[0].uint64_val != (char *)0x0 && 999999999 < uVar4) {
              local_df0.uint64_val = local_e18[0].uint64_val / uptime_s;
            }
            local_dd0 = 4;
            gen_mutex_ctl_str((char *)&sz_1,0x142271,"mutex","num_wait",pcVar15);
            sz_43 = 7;
            sz_57 = 8;
            iVar6 = je_mallctlnametomib((char *)&sz_1,(size_t *)&col_name,&sz_43);
            if (iVar6 == 0) {
              pcVar15 = (char *)0x0;
              col_name.field_3 = aVar3;
              col_name.link.qre_prev = (emitter_col_t *)aVar11;
              iVar6 = je_mallctlbymib((size_t *)&col_name,sz_43,local_dc8,&sz_57,(void *)0x0,0);
              if (iVar6 != 0) goto LAB_0013c8c5;
              local_da8 = 4;
              local_da0 = local_dc8[0];
              if (uVar4 == 0) {
                local_da0 = 0;
              }
              if (local_dc8[0] != 0 && 999999999 < uVar4) {
                local_da0 = local_dc8[0] / uptime_s;
              }
              local_d80 = 4;
              gen_mutex_ctl_str((char *)&sz_1,0x142271,"mutex","num_spin_acq",pcVar15);
              sz_43 = 7;
              sz_57 = 8;
              iVar6 = je_mallctlnametomib((char *)&sz_1,(size_t *)&col_name,&sz_43);
              if (iVar6 == 0) {
                pcVar15 = (char *)0x0;
                col_name.field_3 = aVar3;
                col_name.link.qre_prev = (emitter_col_t *)aVar11;
                iVar6 = je_mallctlbymib((size_t *)&col_name,sz_43,local_d78,&sz_57,(void *)0x0,0);
                if (iVar6 != 0) goto LAB_0013c8c5;
                local_d58 = 4;
                local_d50 = local_d78[0];
                if (uVar4 == 0) {
                  local_d50 = 0;
                }
                if (local_d78[0] != 0 && 999999999 < uVar4) {
                  local_d50 = local_d78[0] / uptime_s;
                }
                local_d30 = 4;
                gen_mutex_ctl_str((char *)&sz_1,0x142271,"mutex","num_owner_switch",pcVar15);
                sz_43 = 7;
                sz_57 = 8;
                iVar6 = je_mallctlnametomib((char *)&sz_1,(size_t *)&col_name,&sz_43);
                if (iVar6 == 0) {
                  pcVar15 = (char *)0x0;
                  col_name.field_3 = aVar3;
                  col_name.link.qre_prev = (emitter_col_t *)aVar11;
                  iVar6 = je_mallctlbymib((size_t *)&col_name,sz_43,local_d28,&sz_57,(void *)0x0,0);
                  if (iVar6 != 0) goto LAB_0013c8c5;
                  local_d08 = 4;
                  local_d00 = local_d28[0];
                  if (uVar4 == 0) {
                    local_d00 = 0;
                  }
                  if (local_d28[0] != 0 && 999999999 < uVar4) {
                    local_d00 = local_d28[0] / uptime_s;
                  }
                  local_ce0 = 4;
                  gen_mutex_ctl_str((char *)&sz_1,0x142271,"mutex","total_wait_time",pcVar15);
                  sz_43 = 7;
                  sz_57 = 8;
                  iVar6 = je_mallctlnametomib((char *)&sz_1,(size_t *)&col_name,&sz_43);
                  if (iVar6 == 0) {
                    pcVar15 = (char *)0x0;
                    col_name.field_3 = aVar3;
                    col_name.link.qre_prev = (emitter_col_t *)aVar11;
                    iVar6 = je_mallctlbymib((size_t *)&col_name,sz_43,local_cd8,&sz_57,(void *)0x0,0
                                           );
                    if (iVar6 != 0) goto LAB_0013c8c5;
                    local_cb8 = 4;
                    local_cb0 = local_cd8[0];
                    if (uVar4 == 0) {
                      local_cb0 = 0;
                    }
                    if (local_cd8[0] != 0 && 999999999 < uVar4) {
                      local_cb0 = local_cd8[0] / uptime_s;
                    }
                    local_c90 = 4;
                    gen_mutex_ctl_str((char *)&sz_1,0x142271,"mutex","max_wait_time",pcVar15);
                    sz_43 = 7;
                    sz_57 = 8;
                    iVar6 = je_mallctlnametomib((char *)&sz_1,(size_t *)&col_name,&sz_43);
                    if (iVar6 == 0) {
                      pcVar15 = (char *)0x0;
                      col_name.field_3 = aVar3;
                      col_name.link.qre_prev = (emitter_col_t *)aVar11;
                      iVar6 = je_mallctlbymib((size_t *)&col_name,sz_43,local_c88,&sz_57,(void *)0x0
                                              ,0);
                      if (iVar6 != 0) goto LAB_0013c8c5;
                      col_mutex32[0].type = emitter_type_uint32;
                      gen_mutex_ctl_str((char *)&sz_1,0x142271,"mutex","max_num_thds",pcVar15);
                      sz_43 = 7;
                      sz_57 = 4;
                      iVar6 = je_mallctlnametomib((char *)&sz_1,(size_t *)&col_name,&sz_43);
                      if (iVar6 == 0) {
                        col_name.field_3 = aVar3;
                        col_name.link.qre_prev = (emitter_col_t *)aVar11;
                        iVar6 = je_mallctlbymib((size_t *)&col_name,sz_43,&col_mutex32[0].field_3,
                                                &sz_57,(void *)0x0,0);
                        if (iVar6 == 0) {
                          emitter_json_object_begin(peVar17);
                          emitter_json_kv(peVar17,"nmalloc",emitter_type_uint64,&nmalloc);
                          emitter_json_kv(peVar17,"ndalloc",emitter_type_uint64,&ndalloc);
                          emitter_json_kv(peVar17,"curregs",emitter_type_size,&curregs);
                          emitter_json_kv(peVar17,"nrequests",emitter_type_uint64,&nrequests);
                          emitter_json_kv(peVar17,"nfills",emitter_type_uint64,&nfills);
                          emitter_json_kv(peVar17,"nflushes",emitter_type_uint64,&nflushes);
                          emitter_json_kv(peVar17,"nreslabs",emitter_type_uint64,&nreslabs);
                          emitter_json_kv(peVar17,"curslabs",emitter_type_size,&curslabs);
                          emitter_json_kv(peVar17,"nonfull_slabs",emitter_type_size,&nonfull_slabs);
                          emitter_json_object_kv_begin(peVar17,"mutex");
                          mutex_stats_emit(peVar17,(emitter_row_t *)0x0,(emitter_col_t *)&sz,
                                           col_mutex32);
                          emitter_json_object_end(peVar17);
                          goto LAB_0013b668;
                        }
                        goto LAB_0013c8c5;
                      }
                    }
                  }
                }
              }
            }
          }
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar15 = (char *)&sz_1;
          goto LAB_0013cab9;
        }
        emitter_json_object_begin(peVar17);
        emitter_json_kv(peVar17,"nmalloc",emitter_type_uint64,&nmalloc);
        emitter_json_kv(peVar17,"ndalloc",emitter_type_uint64,&ndalloc);
        emitter_json_kv(peVar17,"curregs",emitter_type_size,&curregs);
        emitter_json_kv(peVar17,"nrequests",emitter_type_uint64,&nrequests);
        emitter_json_kv(peVar17,"nfills",emitter_type_uint64,&nfills);
        emitter_json_kv(peVar17,"nflushes",emitter_type_uint64,&nflushes);
        emitter_json_kv(peVar17,"nreslabs",emitter_type_uint64,&nreslabs);
        emitter_json_kv(peVar17,"curslabs",emitter_type_size,&curslabs);
        emitter_json_kv(peVar17,"nonfull_slabs",emitter_type_size,&nonfull_slabs);
LAB_0013b668:
        emitter_json_object_end(peVar17);
        uVar9 = nregs * curslabs;
        if (uVar9 < curregs || uVar9 == 0) {
          if (uVar9 == 0) {
LAB_0013b713:
            pcVar15 = "1";
          }
          else {
            pcVar15 = " race";
          }
          malloc_snprintf((char *)&sz_1,6,pcVar15);
        }
        else {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar9;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = curregs * 1000;
          uVar7 = SUB164(auVar2 / auVar1,0);
          if (uVar7 < 10) {
            pcVar15 = "0.00%u";
          }
          else if (uVar7 < 100) {
            pcVar15 = "0.0%u";
          }
          else {
            if (999 < uVar7) goto LAB_0013b713;
            pcVar15 = "0.%u";
          }
          malloc_snprintf((char *)&sz_1,6,pcVar15,SUB168(auVar2 / auVar1,0) & 0xffffffff);
        }
        local_1a0.field_3.uint64_val = curregs * reg_size;
        local_888.field_3.size_val = reg_size;
        local_fa0.int_val = aVar11.int_val;
        local_1c8.field_3.uint64_val = nmalloc;
        local_1f0.field_3.uint64_val = nmalloc;
        if (uVar4 == 0) {
          local_1f0.field_3.uint64_val = 0;
        }
        if (nmalloc != 0 && 999999999 < uVar4) {
          local_1f0.field_3.uint64_val = nmalloc / uptime_s;
        }
        local_218.field_3.uint64_val = ndalloc;
        local_240.field_3.uint64_val = ndalloc;
        if (uVar4 == 0) {
          local_240.field_3.uint64_val = 0;
        }
        if (ndalloc != 0 && 999999999 < uVar4) {
          local_240.field_3.uint64_val = ndalloc / uptime_s;
        }
        local_268.field_3.uint64_val = nrequests;
        local_280 = (char *)nrequests;
        if (uVar4 == 0) {
          local_280 = (char *)0x0;
        }
        if (nrequests != 0 && 999999999 < uVar4) {
          local_280 = (char *)(nrequests / uptime_s);
        }
        col_pgs.field_3.uint64_val = slab_size / page_1;
        local_748.field_3.uint32_val = nshards;
        local_c60.size_val = curregs;
        local_f50.size_val = curslabs;
        col_nonfull_slabs.field_3.size_val = nonfull_slabs;
        col_regs.field_3.uint32_val = nregs;
        col_util.field_3.str_val = (char *)&sz_1;
        col_nfills.field_3.uint64_val = nfills;
        col_nfills_ps.field_3.uint64_val = nfills;
        if (uVar4 == 0) {
          col_nfills_ps.field_3.uint64_val = 0;
        }
        if (nfills != 0 && 999999999 < uVar4) {
          col_nfills_ps.field_3.uint64_val = nfills / uptime_s;
        }
        col_nflushes.field_3.uint64_val = nflushes;
        col_nflushes_ps.field_3.uint64_val = nflushes;
        if (uVar4 == 0) {
          col_nflushes_ps.field_3.uint64_val = 0;
        }
        if (nflushes != 0 && 999999999 < uVar4) {
          col_nflushes_ps.field_3.uint64_val = nflushes / uptime_s;
        }
        col_nslabs.field_3.uint64_val = nslabs;
        col_nreslabs.field_3.uint64_val = nreslabs;
        col_nreslabs_ps.field_3.uint64_val = nreslabs;
        if (uVar4 == 0) {
          col_nreslabs_ps.field_3.uint64_val = 0;
        }
        if (nreslabs != 0 && 999999999 < uVar4) {
          col_nreslabs_ps.field_3.uint64_val = nreslabs / uptime_s;
        }
        emitter_table_row(peVar17,&local_1140);
        bVar16 = (byte)local_1124;
      }
      emitter_json_array_end(local_1158);
      if ((bVar16 & 1) != 0) {
        emitter_table_printf(peVar17,"                     ---\n");
      }
      goto LAB_0013b9c9;
    }
  }
  format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
  pcVar15 = "arenas.nbins";
LAB_0013cab9:
  malloc_printf(format,pcVar15);
  abort();
}

Assistant:

static void
stats_arena_print(emitter_t *emitter, unsigned i, bool bins, bool large,
    bool mutex, bool extents) {
	unsigned nthreads;
	const char *dss;
	ssize_t dirty_decay_ms, muzzy_decay_ms;
	size_t page, pactive, pdirty, pmuzzy, mapped, retained;
	size_t base, internal, resident, metadata_thp, extent_avail;
	uint64_t dirty_npurge, dirty_nmadvise, dirty_purged;
	uint64_t muzzy_npurge, muzzy_nmadvise, muzzy_purged;
	size_t small_allocated;
	uint64_t small_nmalloc, small_ndalloc, small_nrequests, small_nfills,
	    small_nflushes;
	size_t large_allocated;
	uint64_t large_nmalloc, large_ndalloc, large_nrequests, large_nfills,
	    large_nflushes;
	size_t tcache_bytes;
	uint64_t uptime;

	CTL_GET("arenas.page", &page, size_t);

	CTL_M2_GET("stats.arenas.0.nthreads", i, &nthreads, unsigned);
	emitter_kv(emitter, "nthreads", "assigned threads",
	    emitter_type_unsigned, &nthreads);

	CTL_M2_GET("stats.arenas.0.uptime", i, &uptime, uint64_t);
	emitter_kv(emitter, "uptime_ns", "uptime", emitter_type_uint64,
	    &uptime);

	CTL_M2_GET("stats.arenas.0.dss", i, &dss, const char *);
	emitter_kv(emitter, "dss", "dss allocation precedence",
	    emitter_type_string, &dss);

	CTL_M2_GET("stats.arenas.0.dirty_decay_ms", i, &dirty_decay_ms,
	    ssize_t);
	CTL_M2_GET("stats.arenas.0.muzzy_decay_ms", i, &muzzy_decay_ms,
	    ssize_t);
	CTL_M2_GET("stats.arenas.0.pactive", i, &pactive, size_t);
	CTL_M2_GET("stats.arenas.0.pdirty", i, &pdirty, size_t);
	CTL_M2_GET("stats.arenas.0.pmuzzy", i, &pmuzzy, size_t);
	CTL_M2_GET("stats.arenas.0.dirty_npurge", i, &dirty_npurge, uint64_t);
	CTL_M2_GET("stats.arenas.0.dirty_nmadvise", i, &dirty_nmadvise,
	    uint64_t);
	CTL_M2_GET("stats.arenas.0.dirty_purged", i, &dirty_purged, uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_npurge", i, &muzzy_npurge, uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_nmadvise", i, &muzzy_nmadvise,
	    uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_purged", i, &muzzy_purged, uint64_t);

	emitter_row_t decay_row;
	emitter_row_init(&decay_row);

	/* JSON-style emission. */
	emitter_json_kv(emitter, "dirty_decay_ms", emitter_type_ssize,
	    &dirty_decay_ms);
	emitter_json_kv(emitter, "muzzy_decay_ms", emitter_type_ssize,
	    &muzzy_decay_ms);

	emitter_json_kv(emitter, "pactive", emitter_type_size, &pactive);
	emitter_json_kv(emitter, "pdirty", emitter_type_size, &pdirty);
	emitter_json_kv(emitter, "pmuzzy", emitter_type_size, &pmuzzy);

	emitter_json_kv(emitter, "dirty_npurge", emitter_type_uint64,
	    &dirty_npurge);
	emitter_json_kv(emitter, "dirty_nmadvise", emitter_type_uint64,
	    &dirty_nmadvise);
	emitter_json_kv(emitter, "dirty_purged", emitter_type_uint64,
	    &dirty_purged);

	emitter_json_kv(emitter, "muzzy_npurge", emitter_type_uint64,
	    &muzzy_npurge);
	emitter_json_kv(emitter, "muzzy_nmadvise", emitter_type_uint64,
	    &muzzy_nmadvise);
	emitter_json_kv(emitter, "muzzy_purged", emitter_type_uint64,
	    &muzzy_purged);

	/* Table-style emission. */
	COL(decay_row, decay_type, right, 9, title);
	col_decay_type.str_val = "decaying:";

	COL(decay_row, decay_time, right, 6, title);
	col_decay_time.str_val = "time";

	COL(decay_row, decay_npages, right, 13, title);
	col_decay_npages.str_val = "npages";

	COL(decay_row, decay_sweeps, right, 13, title);
	col_decay_sweeps.str_val = "sweeps";

	COL(decay_row, decay_madvises, right, 13, title);
	col_decay_madvises.str_val = "madvises";

	COL(decay_row, decay_purged, right, 13, title);
	col_decay_purged.str_val = "purged";

	/* Title row. */
	emitter_table_row(emitter, &decay_row);

	/* Dirty row. */
	col_decay_type.str_val = "dirty:";

	if (dirty_decay_ms >= 0) {
		col_decay_time.type = emitter_type_ssize;
		col_decay_time.ssize_val = dirty_decay_ms;
	} else {
		col_decay_time.type = emitter_type_title;
		col_decay_time.str_val = "N/A";
	}

	col_decay_npages.type = emitter_type_size;
	col_decay_npages.size_val = pdirty;

	col_decay_sweeps.type = emitter_type_uint64;
	col_decay_sweeps.uint64_val = dirty_npurge;

	col_decay_madvises.type = emitter_type_uint64;
	col_decay_madvises.uint64_val = dirty_nmadvise;

	col_decay_purged.type = emitter_type_uint64;
	col_decay_purged.uint64_val = dirty_purged;

	emitter_table_row(emitter, &decay_row);

	/* Muzzy row. */
	col_decay_type.str_val = "muzzy:";

	if (muzzy_decay_ms >= 0) {
		col_decay_time.type = emitter_type_ssize;
		col_decay_time.ssize_val = muzzy_decay_ms;
	} else {
		col_decay_time.type = emitter_type_title;
		col_decay_time.str_val = "N/A";
	}

	col_decay_npages.type = emitter_type_size;
	col_decay_npages.size_val = pmuzzy;

	col_decay_sweeps.type = emitter_type_uint64;
	col_decay_sweeps.uint64_val = muzzy_npurge;

	col_decay_madvises.type = emitter_type_uint64;
	col_decay_madvises.uint64_val = muzzy_nmadvise;

	col_decay_purged.type = emitter_type_uint64;
	col_decay_purged.uint64_val = muzzy_purged;

	emitter_table_row(emitter, &decay_row);

	/* Small / large / total allocation counts. */
	emitter_row_t alloc_count_row;
	emitter_row_init(&alloc_count_row);

	COL(alloc_count_row, count_title, left, 21, title);
	col_count_title.str_val = "";

	COL(alloc_count_row, count_allocated, right, 16, title);
	col_count_allocated.str_val = "allocated";

	COL(alloc_count_row, count_nmalloc, right, 16, title);
	col_count_nmalloc.str_val = "nmalloc";
	COL(alloc_count_row, count_nmalloc_ps, right, 8, title);
	col_count_nmalloc_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_ndalloc, right, 16, title);
	col_count_ndalloc.str_val = "ndalloc";
	COL(alloc_count_row, count_ndalloc_ps, right, 8, title);
	col_count_ndalloc_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nrequests, right, 16, title);
	col_count_nrequests.str_val = "nrequests";
	COL(alloc_count_row, count_nrequests_ps, right, 10, title);
	col_count_nrequests_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nfills, right, 16, title);
	col_count_nfills.str_val = "nfill";
	COL(alloc_count_row, count_nfills_ps, right, 10, title);
	col_count_nfills_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nflushes, right, 16, title);
	col_count_nflushes.str_val = "nflush";
	COL(alloc_count_row, count_nflushes_ps, right, 10, title);
	col_count_nflushes_ps.str_val = "(#/sec)";

	emitter_table_row(emitter, &alloc_count_row);

	col_count_nmalloc_ps.type = emitter_type_uint64;
	col_count_ndalloc_ps.type = emitter_type_uint64;
	col_count_nrequests_ps.type = emitter_type_uint64;
	col_count_nfills_ps.type = emitter_type_uint64;
	col_count_nflushes_ps.type = emitter_type_uint64;

#define GET_AND_EMIT_ALLOC_STAT(small_or_large, name, valtype)		\
	CTL_M2_GET("stats.arenas.0." #small_or_large "." #name, i,	\
	    &small_or_large##_##name, valtype##_t);			\
	emitter_json_kv(emitter, #name, emitter_type_##valtype,		\
	    &small_or_large##_##name);					\
	col_count_##name.type = emitter_type_##valtype;		\
	col_count_##name.valtype##_val = small_or_large##_##name;

	emitter_json_object_kv_begin(emitter, "small");
	col_count_title.str_val = "small:";

	GET_AND_EMIT_ALLOC_STAT(small, allocated, size)
	GET_AND_EMIT_ALLOC_STAT(small, nmalloc, uint64)
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, ndalloc, uint64)
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nrequests, uint64)
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nfills, uint64)
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nflushes, uint64)
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);

	emitter_table_row(emitter, &alloc_count_row);
	emitter_json_object_end(emitter); /* Close "small". */

	emitter_json_object_kv_begin(emitter, "large");
	col_count_title.str_val = "large:";

	GET_AND_EMIT_ALLOC_STAT(large, allocated, size)
	GET_AND_EMIT_ALLOC_STAT(large, nmalloc, uint64)
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, ndalloc, uint64)
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nrequests, uint64)
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nfills, uint64)
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nflushes, uint64)
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);

	emitter_table_row(emitter, &alloc_count_row);
	emitter_json_object_end(emitter); /* Close "large". */

#undef GET_AND_EMIT_ALLOC_STAT

	/* Aggregated small + large stats are emitter only in table mode. */
	col_count_title.str_val = "total:";
	col_count_allocated.size_val = small_allocated + large_allocated;
	col_count_nmalloc.uint64_val = small_nmalloc + large_nmalloc;
	col_count_ndalloc.uint64_val = small_ndalloc + large_ndalloc;
	col_count_nrequests.uint64_val = small_nrequests + large_nrequests;
	col_count_nfills.uint64_val = small_nfills + large_nfills;
	col_count_nflushes.uint64_val = small_nflushes + large_nflushes;
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);
	emitter_table_row(emitter, &alloc_count_row);

	emitter_row_t mem_count_row;
	emitter_row_init(&mem_count_row);

	emitter_col_t mem_count_title;
	emitter_col_init(&mem_count_title, &mem_count_row);
	mem_count_title.justify = emitter_justify_left;
	mem_count_title.width = 21;
	mem_count_title.type = emitter_type_title;
	mem_count_title.str_val = "";

	emitter_col_t mem_count_val;
	emitter_col_init(&mem_count_val, &mem_count_row);
	mem_count_val.justify = emitter_justify_right;
	mem_count_val.width = 16;
	mem_count_val.type = emitter_type_title;
	mem_count_val.str_val = "";

	emitter_table_row(emitter, &mem_count_row);
	mem_count_val.type = emitter_type_size;

	/* Active count in bytes is emitted only in table mode. */
	mem_count_title.str_val = "active:";
	mem_count_val.size_val = pactive * page;
	emitter_table_row(emitter, &mem_count_row);

#define GET_AND_EMIT_MEM_STAT(stat)					\
	CTL_M2_GET("stats.arenas.0."#stat, i, &stat, size_t);		\
	emitter_json_kv(emitter, #stat, emitter_type_size, &stat);	\
	mem_count_title.str_val = #stat":";				\
	mem_count_val.size_val = stat;					\
	emitter_table_row(emitter, &mem_count_row);

	GET_AND_EMIT_MEM_STAT(mapped)
	GET_AND_EMIT_MEM_STAT(retained)
	GET_AND_EMIT_MEM_STAT(base)
	GET_AND_EMIT_MEM_STAT(internal)
	GET_AND_EMIT_MEM_STAT(metadata_thp)
	GET_AND_EMIT_MEM_STAT(tcache_bytes)
	GET_AND_EMIT_MEM_STAT(resident)
	GET_AND_EMIT_MEM_STAT(extent_avail)
#undef GET_AND_EMIT_MEM_STAT

	if (mutex) {
		stats_arena_mutexes_print(emitter, i, uptime);
	}
	if (bins) {
		stats_arena_bins_print(emitter, mutex, i, uptime);
	}
	if (large) {
		stats_arena_lextents_print(emitter, i, uptime);
	}
	if (extents) {
		stats_arena_extents_print(emitter, i);
	}
}